

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

char * all_testsuites(void)

{
  double dVar1;
  short sVar2;
  int iVar3;
  matrix2 *pmVar4;
  matrix3 *pmVar5;
  matrix4 *pmVar6;
  vector3 *pvVar7;
  quaternion *pqVar8;
  vector2 *pvVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  undefined8 *puVar13;
  double *pdVar14;
  bool bVar15;
  byte bVar16;
  quaternion q;
  quaternion qB;
  quaternion qIdentity;
  double angle1;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  double out_angley_2;
  undefined8 uStack_140;
  undefined8 local_138;
  double out_anglez_2;
  undefined8 uStack_120;
  undefined8 local_118;
  double out_anglex_2;
  undefined8 uStack_100;
  undefined8 local_f8;
  double out_anglez;
  undefined8 uStack_e0;
  undefined8 local_d8;
  vector3 expectedPosition_11;
  anon_union_24_3_07544b15_for_vector3_0 local_48;
  
  bVar16 = 0;
  puts("quaternion_all_tests");
  quaternion_identity(&q);
  sVar2 = scalar_equalsf(q.field_0.q[0],0.0);
  if (sVar2 == 0) {
    test_message = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(9) : (assertion failed) ((scalar_equalsf(q.x, 0.0f)))"
    ;
  }
  else {
    sVar2 = scalar_equalsf(q.field_0.q[1],0.0);
    if (sVar2 == 0) {
      test_message = 
      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(10) : (assertion failed) ((scalar_equalsf(q.y, 0.0f)))"
      ;
    }
    else {
      sVar2 = scalar_equalsf(q.field_0.q[2],0.0);
      if (sVar2 == 0) {
        test_message = 
        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(11) : (assertion failed) ((scalar_equalsf(q.z, 0.0f)))"
        ;
      }
      else {
        sVar2 = scalar_equalsf(q.field_0.q[3],1.0);
        if (sVar2 == 0) {
          test_message = 
          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(12) : (assertion failed) ((scalar_equalsf(q.w, 1.0f)))"
          ;
        }
        else {
          dVar1 = quaternion_norm(&q);
          sVar2 = scalar_equalsf(1.0,dVar1);
          if (sVar2 == 0) {
            test_message = 
            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(13) : (assertion failed) ((scalar_equalsf(1.0f, quaternion_norm(&q))))"
            ;
          }
          else {
            dVar1 = quaternion_magnitude(&q);
            sVar2 = scalar_equalsf(1.0,dVar1);
            if (sVar2 == 0) {
              test_message = 
              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(14) : (assertion failed) ((scalar_equalsf(1.0f, quaternion_magnitude(&q))))"
              ;
            }
            else {
              sVar2 = quaternion_is_unit(&q);
              if (sVar2 == 0) {
                test_message = 
                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(15) : (assertion failed) ((quaternion_is_unit(&q)))"
                ;
              }
              else {
                sVar2 = quaternion_is_pure(&q);
                test_message = (char *)0x0;
                if (sVar2 != 0) {
                  test_message = 
                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(16) : (assertion failed) ((!quaternion_is_pure(&q)))"
                  ;
                }
              }
            }
          }
        }
      }
    }
  }
  tests_run = tests_run + 1;
  if (test_message == (char *)0x0) {
    quaternion_set_from_axis_anglef3(&q,1.0,1.0,1.0,1.5707963705062866);
    quaternion_set_from_axis_anglef3(&qB,-1.0,-1.0,-1.0,1.5707963705062866);
    quaternion_conjugate(&qB);
    iVar3 = quaternion_equals(&q,&qB);
    tests_run = tests_run + 1;
    test_message = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(32) : (assertion failed) ((quaternion_equals(&qA, &qB)))"
    ;
    if (iVar3 != 0) {
      test_message = (char *)0x0;
      quaternion_set_from_axis_anglef3(&q,1.0,1.0,1.0,1.5707963705062866);
      quaternion_set(&qB,&q);
      quaternion_inverse(&qB);
      quaternion_multiply(&q,&qB);
      quaternion_normalize(&q);
      quaternion_identity(&qIdentity);
      iVar3 = quaternion_equals(&q,&qIdentity);
      tests_run = tests_run + 1;
      test_message = 
      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(52) : (assertion failed) ((quaternion_equals(&qA, &qIdentity)))"
      ;
      if (iVar3 != 0) {
        test_message = (char *)0x0;
        pvVar7 = vector3_get_reference_vector3(1);
        quaternion_set_from_axis_anglev3(&q,pvVar7,1.5707963705062866);
        pvVar7 = vector3_get_reference_vector3(1);
        vector3_set((vector3 *)&qIdentity,pvVar7);
        qB.field_0.q[2] = qIdentity.field_0.q[2] * 0.7071067966408575;
        qB.field_0._8_4_ = SUB84(qIdentity.field_0.q[1] * 0.7071067966408575,0);
        qB.field_0.q[0] = qIdentity.field_0.q[0] * 0.7071067966408575;
        qB.field_0._12_4_ = (int)((ulong)(qIdentity.field_0.q[1] * 0.7071067966408575) >> 0x20);
        qB.field_0.q[3] = 0.7071067657322372;
        quaternion_normalize(&qB);
        iVar3 = quaternion_equals(&q,&qB);
        tests_run = tests_run + 1;
        test_message = 
        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(81) : (assertion failed) ((quaternion_equals(&q, &q1)))"
        ;
        if (iVar3 != 0) {
          test_message = (char *)0x0;
          pvVar7 = vector3_get_reference_vector3(1);
          quaternion_set_from_axis_anglev3(&q,pvVar7,0.7853981852531433);
          pvVar7 = vector3_get_reference_vector3(1);
          quaternion_set_from_axis_anglev3(&qB,pvVar7,1.5707963705062866);
          quaternion_multiply(&q,&q);
          iVar3 = quaternion_equals(&q,&qB);
          tests_run = tests_run + 1;
          test_message = 
          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(116) : (assertion failed) ((quaternion_equals(&qA, &qB)))"
          ;
          if (iVar3 != 0) {
            q.field_0.q[0] = 1.0;
            q.field_0.q[1] = 2.0;
            q.field_0.q[2] = 3.0;
            q.field_0.q[3] = 4.0;
            test_message = (char *)0x0;
            quaternion_identity(&qB);
            quaternion_set(&qIdentity,&q);
            quaternion_multiply(&qIdentity,&qB);
            iVar3 = quaternion_equals(&qIdentity,&q);
            tests_run = tests_run + 1;
            test_message = 
            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(136) : (assertion failed) ((quaternion_equals(&q, &qA)))"
            ;
            if (iVar3 != 0) {
              test_message = (char *)0x0;
              pvVar7 = vector3_get_reference_vector3(2);
              quaternion_set_from_axis_anglev3(&q,pvVar7,1.5707963705062866);
              pvVar7 = vector3_get_reference_vector3(1);
              pvVar7 = vector3_set((vector3 *)&qB,pvVar7);
              vector3_rotate_by_quaternion(pvVar7,&q);
              pvVar7 = vector3_get_reference_vector3(6);
              iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
              tests_run = tests_run + 1;
              test_message = 
              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(175) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(6))))"
              ;
              if (iVar3 != 0) {
                test_message = (char *)0x0;
                pvVar7 = vector3_get_reference_vector3(3);
                quaternion_set_from_axis_anglev3(&q,pvVar7,1.5707963705062866);
                pvVar7 = vector3_get_reference_vector3(1);
                pvVar7 = vector3_set((vector3 *)&qB,pvVar7);
                vector3_rotate_by_quaternion(pvVar7,&q);
                pvVar7 = vector3_get_reference_vector3(2);
                iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                tests_run = tests_run + 1;
                test_message = 
                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(201) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(2))))"
                ;
                if (iVar3 != 0) {
                  test_message = (char *)0x0;
                  pvVar7 = vector3_get_reference_vector3(1);
                  quaternion_set_from_axis_anglev3(&q,pvVar7,1.5707963705062866);
                  pvVar7 = vector3_get_reference_vector3(2);
                  pvVar7 = vector3_set((vector3 *)&qB,pvVar7);
                  vector3_rotate_by_quaternion(pvVar7,&q);
                  pvVar7 = vector3_get_reference_vector3(3);
                  iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                  tests_run = tests_run + 1;
                  test_message = 
                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(149) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(3))))"
                  ;
                  if (iVar3 != 0) {
                    test_message = (char *)0x0;
                    pvVar7 = vector3_get_reference_vector3(3);
                    quaternion_set_from_axis_anglev3(&q,pvVar7,1.5707963705062866);
                    pvVar7 = vector3_get_reference_vector3(2);
                    pvVar7 = vector3_set((vector3 *)&qB,pvVar7);
                    vector3_rotate_by_quaternion(pvVar7,&q);
                    pvVar7 = vector3_get_reference_vector3(4);
                    iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                    tests_run = tests_run + 1;
                    test_message = 
                    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(214) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(4))))"
                    ;
                    if (iVar3 != 0) {
                      test_message = (char *)0x0;
                      pvVar7 = vector3_get_reference_vector3(1);
                      quaternion_set_from_axis_anglev3(&q,pvVar7,1.5707963705062866);
                      pvVar7 = vector3_get_reference_vector3(3);
                      pvVar7 = vector3_set((vector3 *)&qB,pvVar7);
                      vector3_rotate_by_quaternion(pvVar7,&q);
                      pvVar7 = vector3_get_reference_vector3(5);
                      iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                      tests_run = tests_run + 1;
                      test_message = 
                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(162) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(5))))"
                      ;
                      if (iVar3 != 0) {
                        test_message = (char *)0x0;
                        pvVar7 = vector3_get_reference_vector3(2);
                        quaternion_set_from_axis_anglev3(&q,pvVar7,1.5707963705062866);
                        pvVar7 = vector3_get_reference_vector3(3);
                        pvVar7 = vector3_set((vector3 *)&qB,pvVar7);
                        vector3_rotate_by_quaternion(pvVar7,&q);
                        pvVar7 = vector3_get_reference_vector3(1);
                        iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                        tests_run = tests_run + 1;
                        test_message = 
                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(188) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(1))))"
                        ;
                        if (iVar3 != 0) {
                          test_message = (char *)0x0;
                          pvVar7 = vector3_get_reference_vector3(2);
                          quaternion_set_from_axis_anglev3(&q,pvVar7,3.1415927410125732);
                          pvVar7 = vector3_get_reference_vector3(1);
                          pvVar7 = vector3_set((vector3 *)&qB,pvVar7);
                          vector3_rotate_by_quaternion(pvVar7,&q);
                          pvVar7 = vector3_get_reference_vector3(4);
                          iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                          tests_run = tests_run + 1;
                          test_message = 
                          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(240) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(4))))"
                          ;
                          if (iVar3 != 0) {
                            test_message = (char *)0x0;
                            pvVar7 = vector3_get_reference_vector3(1);
                            quaternion_set_from_axis_anglev3(&q,pvVar7,3.1415927410125732);
                            pvVar7 = vector3_get_reference_vector3(2);
                            pvVar7 = vector3_set((vector3 *)&qB,pvVar7);
                            vector3_rotate_by_quaternion(pvVar7,&q);
                            pvVar7 = vector3_get_reference_vector3(5);
                            iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                            tests_run = tests_run + 1;
                            test_message = 
                            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(227) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(5))))"
                            ;
                            if (iVar3 != 0) {
                              test_message = (char *)0x0;
                              pvVar7 = vector3_get_reference_vector3(1);
                              vector3_set((vector3 *)&qB,pvVar7);
                              quaternion_set_from_axis_anglev3(&q,(vector3 *)&qB,1.5707963705062866)
                              ;
                              quaternion_get_axis_anglev3(&q,(vector3 *)&qIdentity,&angle1);
                              iVar3 = vector3_equals((vector3 *)&qB,(vector3 *)&qIdentity);
                              if (iVar3 == 0) {
                                test_message = 
                                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(99) : (assertion failed) ((vector3_equals(&axis, &axis1)))"
                                ;
                              }
                              else {
                                sVar2 = scalar_equalsf(1.5707963705062866,angle1);
                                test_message = (char *)0x0;
                                if (sVar2 == 0) {
                                  test_message = 
                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(100) : (assertion failed) ((scalar_equalsf(angle, angle1)))"
                                  ;
                                }
                              }
                              tests_run = tests_run + 1;
                              if (test_message == (char *)0x0) {
                                pvVar7 = vector3_get_reference_vector3(1);
                                quaternion_set_from_axis_anglev3(&qB,pvVar7,1.5707963705062866);
                                pvVar7 = vector3_get_reference_vector3(1);
                                quaternion_set_from_axis_anglev3
                                          (&qIdentity,pvVar7,1.7278760450076192);
                                pvVar7 = vector3_get_reference_vector3(1);
                                quaternion_set_from_axis_anglev3
                                          ((quaternion *)&angle1,pvVar7,1.8849557195089517);
                                quaternion_slerp(&qB,(quaternion *)&angle1,0.5,&q);
                                iVar3 = quaternion_equals(&q,&qIdentity);
                                if (iVar3 == 0) {
                                  test_message = 
                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(259) : (assertion failed) ((quaternion_equals(&q, &q2)))"
                                  ;
                                }
                                else {
                                  quaternion_slerp(&qB,(quaternion *)&angle1,0.0,&q);
                                  iVar3 = quaternion_equals(&q,&qB);
                                  if (iVar3 == 0) {
                                    test_message = 
                                    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(263) : (assertion failed) ((quaternion_equals(&q, &q1)))"
                                    ;
                                  }
                                  else {
                                    quaternion_slerp(&qB,(quaternion *)&angle1,1.0,&q);
                                    iVar3 = quaternion_equals(&q,(quaternion *)&angle1);
                                    if (iVar3 == 0) {
                                      test_message = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(267) : (assertion failed) ((quaternion_equals(&q, &q3)))"
                                      ;
                                    }
                                    else {
                                      quaternion_slerp((quaternion *)&angle1,&qB,0.5,&q);
                                      iVar3 = quaternion_equals(&q,&qIdentity);
                                      if (iVar3 == 0) {
                                        test_message = 
                                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(272) : (assertion failed) ((quaternion_equals(&q, &q2)))"
                                        ;
                                      }
                                      else {
                                        quaternion_slerp((quaternion *)&angle1,&qB,0.0,&q);
                                        iVar3 = quaternion_equals(&q,(quaternion *)&angle1);
                                        if (iVar3 == 0) {
                                          test_message = 
                                          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(276) : (assertion failed) ((quaternion_equals(&q, &q3)))"
                                          ;
                                        }
                                        else {
                                          quaternion_slerp((quaternion *)&angle1,&qB,1.0,&q);
                                          iVar3 = quaternion_equals(&q,&qB);
                                          if (iVar3 == 0) {
                                            test_message = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(280) : (assertion failed) ((quaternion_equals(&q, &q1)))"
                                            ;
                                          }
                                          else {
                                            pvVar7 = vector3_get_reference_vector3(1);
                                            quaternion_set_from_axis_anglev3
                                                      (&qB,pvVar7,1.5707963705062866);
                                            pvVar7 = vector3_get_reference_vector3(1);
                                            quaternion_set_from_axis_anglev3
                                                      (&qIdentity,pvVar7,1.413716696004954);
                                            pvVar7 = vector3_get_reference_vector3(1);
                                            quaternion_set_from_axis_anglev3
                                                      ((quaternion *)&angle1,pvVar7,
                                                       1.2566371151303812);
                                            quaternion_slerp(&qB,(quaternion *)&angle1,0.5,&q);
                                            iVar3 = quaternion_equals(&q,&qIdentity);
                                            if (iVar3 == 0) {
                                              test_message = 
                                              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(290) : (assertion failed) ((quaternion_equals(&q, &q2)))"
                                              ;
                                            }
                                            else {
                                              quaternion_slerp(&qB,(quaternion *)&angle1,0.0,&q);
                                              iVar3 = quaternion_equals(&q,&qB);
                                              if (iVar3 == 0) {
                                                test_message = 
                                                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(294) : (assertion failed) ((quaternion_equals(&q, &q1)))"
                                                ;
                                              }
                                              else {
                                                quaternion_slerp(&qB,(quaternion *)&angle1,1.0,&q);
                                                iVar3 = quaternion_equals(&q,(quaternion *)&angle1);
                                                if (iVar3 == 0) {
                                                  test_message = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(298) : (assertion failed) ((quaternion_equals(&q, &q3)))"
                                                  ;
                                                }
                                                else {
                                                  quaternion_slerp((quaternion *)&angle1,&qB,0.5,&q)
                                                  ;
                                                  iVar3 = quaternion_equals(&q,&qIdentity);
                                                  if (iVar3 == 0) {
                                                    test_message = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(303) : (assertion failed) ((quaternion_equals(&q, &q2)))"
                                                  ;
                                                  }
                                                  else {
                                                    quaternion_slerp((quaternion *)&angle1,&qB,0.0,
                                                                     &q);
                                                    iVar3 = quaternion_equals(&q,(quaternion *)
                                                                                 &angle1);
                                                    if (iVar3 == 0) {
                                                      test_message = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(307) : (assertion failed) ((quaternion_equals(&q, &q3)))"
                                                  ;
                                                  }
                                                  else {
                                                    quaternion_slerp((quaternion *)&angle1,&qB,1.0,
                                                                     &q);
                                                    iVar3 = quaternion_equals(&q,&qB);
                                                    test_message = (char *)0x0;
                                                    if (iVar3 == 0) {
                                                      test_message = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(311) : (assertion failed) ((quaternion_equals(&q, &q1)))"
                                                  ;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                tests_run = tests_run + 1;
                                if (test_message == (char *)0x0) {
                                  quaternion_set_from_euler_anglesf3
                                            (&q,0.800000011920929,0.699999988079071,
                                             0.4320000112056732);
                                  quaternion_get_euler_anglesf3
                                            (&q,(double *)&qIdentity,&angle1,&out_anglez);
                                  sVar2 = scalar_equalsf(0.800000011920929,qIdentity.field_0.q[0]);
                                  if (sVar2 == 0) {
                                    test_message = 
                                    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(334) : (assertion failed) ((scalar_equalsf(in_anglex, out_anglex)))"
                                    ;
                                  }
                                  else {
                                    sVar2 = scalar_equalsf(0.699999988079071,angle1);
                                    if (sVar2 == 0) {
                                      test_message = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(335) : (assertion failed) ((scalar_equalsf(in_angley, out_angley)))"
                                      ;
                                    }
                                    else {
                                      sVar2 = scalar_equalsf(0.4320000112056732,out_anglez);
                                      if (sVar2 == 0) {
                                        test_message = 
                                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(336) : (assertion failed) ((scalar_equalsf(in_anglez, out_anglez)))"
                                        ;
                                      }
                                      else {
                                        quaternion_set_from_euler_anglesf3
                                                  (&qB,qIdentity.field_0.q[0],angle1,out_anglez);
                                        iVar3 = quaternion_equals(&q,&qB);
                                        test_message = (char *)0x0;
                                        if (iVar3 == 0) {
                                          test_message = 
                                          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(342) : (assertion failed) ((quaternion_equals(&q1, &q2)))"
                                          ;
                                        }
                                      }
                                    }
                                  }
                                  tests_run = tests_run + 1;
                                  if (test_message == (char *)0x0) {
                                    quaternion_set_from_euler_anglesf3
                                              (&qB,0.800000011920929,0.800000011920929,
                                               0.800000011920929);
                                    pqVar8 = quaternion_identity(&q);
                                    quaternion_rotate_by_quaternion_EXP(&qB,pqVar8);
                                    quaternion_get_euler_anglesf3
                                              (&qB,(double *)&qIdentity,&angle1,&out_anglez);
                                    sVar2 = scalar_equalsf(0.800000011920929,qIdentity.field_0.q[0])
                                    ;
                                    if (sVar2 == 0) {
                                      test_message = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(369) : (assertion failed) ((scalar_equalsf(in_anglex, out_anglex)))"
                                      ;
                                    }
                                    else {
                                      sVar2 = scalar_equalsf(0.800000011920929,angle1);
                                      if (sVar2 == 0) {
                                        test_message = 
                                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(370) : (assertion failed) ((scalar_equalsf(in_angley, out_angley)))"
                                        ;
                                      }
                                      else {
                                        sVar2 = scalar_equalsf(0.800000011920929,out_anglez);
                                        if (sVar2 == 0) {
                                          test_message = 
                                          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(371) : (assertion failed) ((scalar_equalsf(in_anglez, out_anglez)))"
                                          ;
                                        }
                                        else {
                                          quaternion_identity(&qB);
                                          pqVar8 = quaternion_set_from_euler_anglesf3
                                                             (&q,0.800000011920929,0.800000011920929
                                                              ,0.800000011920929);
                                          quaternion_rotate_by_quaternion_EXP(&qB,pqVar8);
                                          quaternion_get_euler_anglesf3
                                                    (&qB,(double *)&qIdentity,&angle1,&out_anglez);
                                          sVar2 = scalar_equalsf(0.800000011920929,
                                                                 qIdentity.field_0.q[0]);
                                          if (sVar2 == 0) {
                                            test_message = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(383) : (assertion failed) ((scalar_equalsf(in_anglex, out_anglex)))"
                                            ;
                                          }
                                          else {
                                            sVar2 = scalar_equalsf(0.800000011920929,angle1);
                                            if (sVar2 == 0) {
                                              test_message = 
                                              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(384) : (assertion failed) ((scalar_equalsf(in_angley, out_angley)))"
                                              ;
                                            }
                                            else {
                                              sVar2 = scalar_equalsf(0.800000011920929,out_anglez);
                                              test_message = (char *)0x0;
                                              if (sVar2 == 0) {
                                                test_message = 
                                                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(385) : (assertion failed) ((scalar_equalsf(in_anglez, out_anglez)))"
                                                ;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                    tests_run = tests_run + 1;
                                    if (test_message == (char *)0x0) {
                                      quaternion_set_from_axis_anglef3
                                                (&q,0.4000000059604645,0.23199999332427979,
                                                 0.5429999828338623,2.8274333477020264);
                                      quaternion_get_euler_anglesf3
                                                (&q,(double *)&qIdentity,&angle1,&out_anglez);
                                      quaternion_set_from_euler_anglesf3
                                                (&qB,qIdentity.field_0.q[0],angle1,out_anglez);
                                      quaternion_get_euler_anglesf3
                                                (&qB,&out_anglex_2,&out_angley_2,&out_anglez_2);
                                      sVar2 = scalar_equalsf(qIdentity.field_0.q[0],out_anglex_2);
                                      if (sVar2 == 0) {
                                        test_message = 
                                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(410) : (assertion failed) ((scalar_equalsf(in_anglex, out_anglex)))"
                                        ;
                                      }
                                      else {
                                        sVar2 = scalar_equalsf(angle1,out_angley_2);
                                        if (sVar2 == 0) {
                                          test_message = 
                                          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(411) : (assertion failed) ((scalar_equalsf(in_angley, out_angley)))"
                                          ;
                                        }
                                        else {
                                          sVar2 = scalar_equalsf(out_anglez,out_anglez_2);
                                          if (sVar2 == 0) {
                                            test_message = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(412) : (assertion failed) ((scalar_equalsf(in_anglez, out_anglez)))"
                                            ;
                                          }
                                          else {
                                            iVar3 = quaternion_equals(&q,&qB);
                                            test_message = (char *)0x0;
                                            if (iVar3 == 0) {
                                              test_message = 
                                              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(415) : (assertion failed) ((quaternion_equals(&q1, &q2)))"
                                              ;
                                            }
                                          }
                                        }
                                      }
                                      tests_run = tests_run + 1;
                                      if (test_message == (char *)0x0) {
                                        quaternion_set_from_euler_anglesf3
                                                  (&q,0.0,6.370451927185059,0.0);
                                        quaternion_get_euler_anglesf3
                                                  (&q,(double *)&qB,(double *)&qIdentity,&angle1);
                                        sVar2 = scalar_equalsf(0.0,qB.field_0.q[0]);
                                        if (sVar2 == 0) {
                                          test_message = 
                                          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(432) : (assertion failed) ((scalar_equalsf(0.0f, out_anglex)))"
                                          ;
                                        }
                                        else {
                                          sVar2 = scalar_equalsf(5.0,qIdentity.field_0.q[0] *
                                                                     57.295780181884766);
                                          if (sVar2 == 0) {
                                            test_message = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(435) : (assertion failed) ((scalar_equalsf(5.0f, ((out_angley) * 57.2957795130823208767981548141052f))))"
                                            ;
                                          }
                                          else {
                                            sVar2 = scalar_equalsf(0.0,angle1);
                                            test_message = (char *)0x0;
                                            if (sVar2 == 0) {
                                              test_message = 
                                              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(437) : (assertion failed) ((scalar_equalsf(0.0f, out_anglez)))"
                                              ;
                                            }
                                          }
                                        }
                                        tests_run = tests_run + 1;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  tests_run = tests_run + 1;
  if (test_message == (char *)0x0) {
    puts("matrix2_all_tests");
    matrix2_zero((matrix2 *)&q);
    pcVar12 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(11) : (assertion failed) ((scalar_equalsf(zero.m[i], 0.0f)))"
    ;
    lVar11 = 0;
    do {
      lVar10 = lVar11;
      if (lVar10 == 4) {
        pcVar12 = (char *)0x0;
        break;
      }
      sVar2 = scalar_equalsf(q.field_0.q[lVar10],0.0);
      lVar11 = lVar10 + 1;
    } while (sVar2 != 0);
    tests_run = tests_run + 1;
    if (lVar10 == 4) {
      test_message = pcVar12;
      matrix2_identity((matrix2 *)&qB);
      _matrix2_set_random((matrix2 *)&q);
      iVar3 = matrix2_equals((matrix2 *)&qB,(matrix2 *)&qB);
      if (iVar3 == 0) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(26) : (assertion failed) ((matrix2_equals(&identity, &identity)))"
        ;
      }
      else {
        iVar3 = matrix2_equals((matrix2 *)&qB,(matrix2 *)&q);
        pcVar12 = (char *)0x0;
        if (iVar3 != 0) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(29) : (assertion failed) ((matrix2_equals(&identity, &m) == 0))"
          ;
        }
      }
      tests_run = tests_run + 1;
      if (pcVar12 == (char *)0x0) {
        test_message = pcVar12;
        matrix2_identity((matrix2 *)&qIdentity);
        _matrix2_set_random((matrix2 *)&q);
        matrix2_set((matrix2 *)&qB,(matrix2 *)&q);
        matrix2_multiply((matrix2 *)&qB,(matrix2 *)&qIdentity);
        iVar3 = matrix2_equals((matrix2 *)&qB,(matrix2 *)&q);
        tests_run = tests_run + 1;
        test_message = (char *)0x0;
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(49) : (assertion failed) ((matrix2_equals(&m2, &m1)))"
        ;
        if (iVar3 != 0) {
          q.field_0.q[0] = 1.0;
          q.field_0.q[1] = 2.0;
          q.field_0.q[2] = 5.0;
          q.field_0.q[3] = 6.0;
          qIdentity.field_0.q[0] = 11.0;
          qIdentity.field_0.q[1] = 14.0;
          qIdentity.field_0.q[2] = 35.0;
          qIdentity.field_0.q[3] = 46.0;
          matrix2_set((matrix2 *)&qB,(matrix2 *)&q);
          matrix2_multiply((matrix2 *)&qB,(matrix2 *)&q);
          iVar3 = matrix2_equals((matrix2 *)&qIdentity,(matrix2 *)&qB);
          tests_run = tests_run + 1;
          test_message = (char *)0x0;
          pcVar12 = 
          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(69) : (assertion failed) ((matrix2_equals(&mR, &m2)))"
          ;
          if (iVar3 != 0) {
            qB.field_0.q[1] = 1.399999976158142;
            qB.field_0.q[0] = 4.300000190734863;
            qIdentity.field_0.q[0] = 4.300000190734863;
            qIdentity.field_0.q[1] = 1.399999976158142;
            matrix2_identity((matrix2 *)&q);
            vector2_multiplym2((vector2 *)&qB,(matrix2 *)&q);
            iVar3 = vector2_equals((vector2 *)&qB,(vector2 *)&qIdentity);
            tests_run = tests_run + 1;
            test_message = (char *)0x0;
            pcVar12 = 
            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(209) : (assertion failed) ((vector2_equals(&startingPosition, &expectedPosition)))"
            ;
            if (iVar3 != 0) {
              matrix2_zero((matrix2 *)&q);
              matrix2_zero((matrix2 *)&qB);
              matrix2_zero((matrix2 *)&qIdentity);
              _matrix2_set_random((matrix2 *)&qIdentity);
              matrix2_set((matrix2 *)&q,(matrix2 *)&qIdentity);
              matrix2_set((matrix2 *)&qB,(matrix2 *)&qIdentity);
              iVar3 = matrix2_equals((matrix2 *)&q,(matrix2 *)&qB);
              if (iVar3 == 0) {
                pcVar12 = 
                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(167) : (assertion failed) ((matrix2_equals(&c, &r)))"
                ;
              }
              else {
                iVar3 = matrix2_equals((matrix2 *)&q,(matrix2 *)&qIdentity);
                if (iVar3 == 0) {
                  pcVar12 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(168) : (assertion failed) ((matrix2_equals(&c, &m)))"
                  ;
                }
                else {
                  iVar3 = matrix2_equals((matrix2 *)&qIdentity,(matrix2 *)&qB);
                  if (iVar3 == 0) {
                    pcVar12 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(169) : (assertion failed) ((matrix2_equals(&m, &r)))"
                    ;
                  }
                  else {
                    _matrix2_transpose_rowcolumn((matrix2 *)&qB);
                    _matrix2_transpose_columnrow((matrix2 *)&q);
                    iVar3 = matrix2_equals((matrix2 *)&q,(matrix2 *)&qB);
                    if (iVar3 == 0) {
                      pcVar12 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(175) : (assertion failed) ((matrix2_equals(&c, &r)))"
                      ;
                    }
                    else {
                      iVar3 = matrix2_equals((matrix2 *)&q,(matrix2 *)&qIdentity);
                      if (iVar3 == 0) {
                        iVar3 = matrix2_equals((matrix2 *)&qIdentity,(matrix2 *)&qB);
                        if (iVar3 == 0) {
                          matrix2_transpose((matrix2 *)&qIdentity);
                          iVar3 = matrix2_equals((matrix2 *)&q,(matrix2 *)&qIdentity);
                          if (iVar3 == 0) {
                            pcVar12 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(181) : (assertion failed) ((matrix2_equals(&c, &m)))"
                            ;
                          }
                          else {
                            iVar3 = matrix2_equals((matrix2 *)&qIdentity,(matrix2 *)&qB);
                            pcVar12 = (char *)0x0;
                            if (iVar3 == 0) {
                              pcVar12 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(182) : (assertion failed) ((matrix2_equals(&m, &r)))"
                              ;
                            }
                          }
                        }
                        else {
                          pcVar12 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(177) : (assertion failed) ((matrix2_equals(&m, &r) == 0))"
                          ;
                        }
                      }
                      else {
                        pcVar12 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(176) : (assertion failed) ((matrix2_equals(&c, &m) == 0))"
                        ;
                      }
                    }
                  }
                }
              }
              tests_run = tests_run + 1;
              if (pcVar12 == (char *)0x0) {
                q.field_0.q[2] = 2.0;
                q.field_0.q[3] = 3.0;
                q.field_0.q[0] = 0.0;
                q.field_0.q[1] = 1.0;
                qB.field_0.q[2] = 1.0;
                qB.field_0.q[3] = 3.0;
                qB.field_0._0_16_ = ZEXT816(0x4000000000000000) << 0x40;
                test_message = pcVar12;
                matrix2_transpose((matrix2 *)&q);
                iVar3 = matrix2_equals((matrix2 *)&q,(matrix2 *)&qB);
                tests_run = tests_run + 1;
                test_message = (char *)0x0;
                pcVar12 = 
                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(194) : (assertion failed) ((matrix2_equals(&m, &e)))"
                ;
                if (iVar3 != 0) {
                  q.field_0.q[2] = 7.0;
                  q.field_0.q[3] = 2.0;
                  q.field_0.q[0] = 5.0;
                  q.field_0.q[1] = 3.0;
                  dVar1 = matrix2_determinant((matrix2 *)&q);
                  sVar2 = scalar_equalsf(dVar1,-11.0);
                  tests_run = tests_run + 1;
                  test_message = (char *)0x0;
                  pcVar12 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(79) : (assertion failed) ((scalar_equalsf(matrix2_determinant(&m), -11)))"
                  ;
                  if (sVar2 != 0) {
                    q.field_0.q[2] = 3.0;
                    q.field_0.q[3] = -5.0;
                    q.field_0.q[0] = 8.0;
                    q.field_0.q[1] = 4.0;
                    dVar1 = matrix2_determinant((matrix2 *)&q);
                    sVar2 = scalar_equalsf(dVar1,-52.0);
                    tests_run = tests_run + 1;
                    test_message = (char *)0x0;
                    pcVar12 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(88) : (assertion failed) ((scalar_equalsf(matrix2_determinant(&m), -52)))"
                    ;
                    if (sVar2 != 0) {
                      q.field_0.q[2] = 1.0;
                      q.field_0.q[3] = 2.0;
                      q.field_0.q[0] = 2.0;
                      q.field_0.q[1] = -3.0;
                      dVar1 = matrix2_determinant((matrix2 *)&q);
                      sVar2 = scalar_equalsf(dVar1,7.0);
                      tests_run = tests_run + 1;
                      test_message = (char *)0x0;
                      pcVar12 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(97) : (assertion failed) ((scalar_equalsf(matrix2_determinant(&m), 7)))"
                      ;
                      if (sVar2 != 0) {
                        q.field_0.q[2] = 0.558388;
                        q.field_0.q[3] = 0.722123;
                        q.field_0.q[0] = 0.608088;
                        q.field_0.q[1] = 0.742654;
                        dVar1 = matrix2_determinant((matrix2 *)&q);
                        sVar2 = scalar_equalsf(dVar1,0.024425249);
                        tests_run = tests_run + 1;
                        test_message = (char *)0x0;
                        pcVar12 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(106) : (assertion failed) ((scalar_equalsf(matrix2_determinant(&m), (double)0.024425249)))"
                        ;
                        if (sVar2 != 0) {
                          q.field_0.q[2] = -1.0;
                          q.field_0.q[3] = 5.0;
                          q.field_0.q[0] = 2.0;
                          q.field_0.q[1] = 0.0;
                          matrix2_identity((matrix2 *)&qB);
                          matrix2_identity((matrix2 *)&q);
                          pmVar4 = matrix2_set((matrix2 *)&qIdentity,(matrix2 *)&q);
                          pmVar4 = matrix2_invert(pmVar4);
                          if (pmVar4 == (matrix2 *)0x0) {
                            pcVar12 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(125) : (assertion failed) ((hasInverse))"
                            ;
                          }
                          else {
                            matrix2_identity((matrix2 *)&angle1);
                            matrix2_multiply((matrix2 *)&angle1,(matrix2 *)&qIdentity);
                            matrix2_multiply((matrix2 *)&angle1,(matrix2 *)&q);
                            iVar3 = matrix2_equals((matrix2 *)&qB,(matrix2 *)&angle1);
                            pcVar12 = (char *)0x0;
                            if (iVar3 == 0) {
                              pcVar12 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(131) : (assertion failed) ((matrix2_equals(&identity, &scratchMatrix)))"
                              ;
                            }
                          }
                          tests_run = tests_run + 1;
                          if (pcVar12 == (char *)0x0) {
                            q.field_0.q[2] = -1.0;
                            q.field_0.q[3] = 5.0;
                            q.field_0.q[0] = 2.0;
                            q.field_0.q[1] = 0.0;
                            test_message = pcVar12;
                            matrix2_invert((matrix2 *)&q);
                            pcVar12 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(145) : (assertion failed) ((scalar_equalsf(m.m[i], expected.m[i])))"
                            ;
                            lVar11 = 0;
                            do {
                              lVar10 = lVar11;
                              if (lVar10 == 0x20) {
                                pcVar12 = (char *)0x0;
                                break;
                              }
                              sVar2 = scalar_equalsf(*(double *)((long)&q.field_0 + lVar10),
                                                     *(double *)((long)&DAT_00114ef0 + lVar10));
                              lVar11 = lVar10 + 8;
                            } while (sVar2 != 0);
                            tests_run = tests_run + 1;
                            if (lVar10 == 0x20) {
                              qB.field_0._0_16_ = ZEXT816(0x3ff0000000000000) << 0x40;
                              qIdentity.field_0.q[0] = 0.10000000149011612;
                              qIdentity.field_0.q[1] = 0.10000000149011612;
                              angle1 = 0.0;
                              uStack_1c0 = 0.10000000149011612;
                              test_message = pcVar12;
                              matrix2_make_transformation_scalingv2
                                        ((matrix2 *)&q,(vector2 *)&qIdentity);
                              vector2_multiplym2((vector2 *)&qB,(matrix2 *)&q);
                              iVar3 = vector2_equals((vector2 *)&qB,(vector2 *)&angle1);
                              tests_run = tests_run + 1;
                              test_message = (char *)0x0;
                              pcVar12 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(225) : (assertion failed) ((vector2_equals(&startingPosition, &expectedPosition)))"
                              ;
                              if (iVar3 != 0) {
                                matrix2_make_transformation_rotationf_z
                                          ((matrix2 *)&q,1.5707963705062866);
                                pvVar9 = vector2_get_reference_vector2(1);
                                vector2_set((vector2 *)&qB,pvVar9);
                                vector2_multiplym2((vector2 *)&qB,(matrix2 *)&q);
                                pvVar9 = vector2_get_reference_vector2(2);
                                iVar3 = vector2_equals((vector2 *)&qB,pvVar9);
                                tests_run = tests_run + 1;
                                test_message = (char *)0x0;
                                pcVar12 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(239) : (assertion failed) ((vector2_equals(&r, vector2_get_reference_vector2(2))))"
                                ;
                                if (iVar3 != 0) {
                                  pvVar9 = vector2_get_reference_vector2(1);
                                  vector2_set((vector2 *)&qB,pvVar9);
                                  matrix2_identity((matrix2 *)&q);
                                  matrix2_rotate((matrix2 *)&q,1.5707963705062866);
                                  vector2_multiplym2((vector2 *)&qB,(matrix2 *)&q);
                                  pvVar9 = vector2_get_reference_vector2(2);
                                  iVar3 = vector2_equals((vector2 *)&qB,pvVar9);
                                  tests_run = tests_run + 1;
                                  test_message = (char *)0x0;
                                  pcVar12 = 
                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(254) : (assertion failed) ((vector2_equals(&r, vector2_get_reference_vector2(2))))"
                                  ;
                                  if (iVar3 != 0) {
                                    pvVar9 = vector2_get_reference_vector2(1);
                                    vector2_set((vector2 *)&qB,pvVar9);
                                    matrix2_identity((matrix2 *)&q);
                                    matrix2_rotate((matrix2 *)&q,-1.5707963705062866);
                                    vector2_multiplym2((vector2 *)&qB,(matrix2 *)&q);
                                    pvVar9 = vector2_get_reference_vector2(4);
                                    iVar3 = vector2_equals((vector2 *)&qB,pvVar9);
                                    pcVar12 = (char *)0x0;
                                    if (iVar3 == 0) {
                                      pcVar12 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(269) : (assertion failed) ((vector2_equals(&r, vector2_get_reference_vector2(4))))"
                                      ;
                                    }
                                    tests_run = tests_run + 1;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    tests_run = tests_run + 1;
    test_message = pcVar12;
    if (pcVar12 == (char *)0x0) {
      puts("matrix3_all_tests");
      matrix3_zero((matrix3 *)&q);
      pcVar12 = 
      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(11) : (assertion failed) ((scalar_equalsf(zero.m[i], 0.0f)))"
      ;
      lVar11 = 0;
      do {
        lVar10 = lVar11;
        if (lVar10 == 9) {
          pcVar12 = (char *)0x0;
          break;
        }
        sVar2 = scalar_equalsf(q.field_0.q[lVar10],0.0);
        lVar11 = lVar10 + 1;
      } while (sVar2 != 0);
      tests_run = tests_run + 1;
      if (lVar10 == 9) {
        test_message = pcVar12;
        matrix3_identity((matrix3 *)&qB);
        _matrix3_set_random((matrix3 *)&q);
        iVar3 = matrix3_equals((matrix3 *)&qB,(matrix3 *)&qB);
        if (iVar3 == 0) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(26) : (assertion failed) ((matrix3_equals(&identity, &identity)))"
          ;
        }
        else {
          iVar3 = matrix3_equals((matrix3 *)&qB,(matrix3 *)&q);
          pcVar12 = (char *)0x0;
          if (iVar3 != 0) {
            pcVar12 = 
            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(29) : (assertion failed) ((matrix3_equals(&identity, &m) == 0))"
            ;
          }
        }
        tests_run = tests_run + 1;
        if (pcVar12 == (char *)0x0) {
          test_message = pcVar12;
          matrix3_identity((matrix3 *)&qIdentity);
          _matrix3_set_random((matrix3 *)&q);
          matrix3_set((matrix3 *)&qB,(matrix3 *)&q);
          matrix3_multiply((matrix3 *)&qB,(matrix3 *)&qIdentity);
          iVar3 = matrix3_equals((matrix3 *)&qB,(matrix3 *)&q);
          tests_run = tests_run + 1;
          test_message = (char *)0x0;
          pcVar12 = 
          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(49) : (assertion failed) ((matrix3_equals(&m2, &m1)))"
          ;
          if (iVar3 != 0) {
            q.field_0.q[0] = 1.0;
            q.field_0.q[1] = 2.0;
            q.field_0.q[2] = 3.0;
            q.field_0.q[3] = 5.0;
            qIdentity.field_0.q[0] = 38.0;
            qIdentity.field_0.q[1] = 44.0;
            qIdentity.field_0.q[2] = 50.0;
            qIdentity.field_0.q[3] = 98.0;
            matrix3_set((matrix3 *)&qB,(matrix3 *)&q);
            matrix3_multiply((matrix3 *)&qB,(matrix3 *)&q);
            iVar3 = matrix3_equals((matrix3 *)&qIdentity,(matrix3 *)&qB);
            tests_run = tests_run + 1;
            test_message = (char *)0x0;
            pcVar12 = 
            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(71) : (assertion failed) ((matrix3_equals(&mR, &m2)))"
            ;
            if (iVar3 != 0) {
              qB.field_0.q[1] = 1.399999976158142;
              qB.field_0.q[0] = 4.300000190734863;
              qIdentity.field_0.q[0] = 4.300000190734863;
              qIdentity.field_0.q[1] = 1.399999976158142;
              matrix3_identity((matrix3 *)&q);
              vector2_multiplym3((vector2 *)&qB,(matrix3 *)&q);
              iVar3 = vector2_equals((vector2 *)&qB,(vector2 *)&qIdentity);
              tests_run = tests_run + 1;
              test_message = (char *)0x0;
              pcVar12 = 
              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(220) : (assertion failed) ((vector2_equals(&startingPosition, &expectedPosition)))"
              ;
              if (iVar3 != 0) {
                matrix3_zero((matrix3 *)&q);
                matrix3_zero((matrix3 *)&qB);
                matrix3_zero((matrix3 *)&qIdentity);
                _matrix3_set_random((matrix3 *)&qIdentity);
                matrix3_set((matrix3 *)&q,(matrix3 *)&qIdentity);
                matrix3_set((matrix3 *)&qB,(matrix3 *)&qIdentity);
                iVar3 = matrix3_equals((matrix3 *)&q,(matrix3 *)&qB);
                if (iVar3 == 0) {
                  pcVar12 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(178) : (assertion failed) ((matrix3_equals(&c, &r)))"
                  ;
                }
                else {
                  iVar3 = matrix3_equals((matrix3 *)&q,(matrix3 *)&qIdentity);
                  if (iVar3 == 0) {
                    pcVar12 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(179) : (assertion failed) ((matrix3_equals(&c, &m)))"
                    ;
                  }
                  else {
                    iVar3 = matrix3_equals((matrix3 *)&qIdentity,(matrix3 *)&qB);
                    if (iVar3 == 0) {
                      pcVar12 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(180) : (assertion failed) ((matrix3_equals(&m, &r)))"
                      ;
                    }
                    else {
                      _matrix3_transpose_rowcolumn((matrix3 *)&qB);
                      _matrix3_transpose_columnrow((matrix3 *)&q);
                      iVar3 = matrix3_equals((matrix3 *)&q,(matrix3 *)&qB);
                      if (iVar3 == 0) {
                        pcVar12 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(186) : (assertion failed) ((matrix3_equals(&c, &r)))"
                        ;
                      }
                      else {
                        iVar3 = matrix3_equals((matrix3 *)&q,(matrix3 *)&qIdentity);
                        if (iVar3 == 0) {
                          iVar3 = matrix3_equals((matrix3 *)&qIdentity,(matrix3 *)&qB);
                          if (iVar3 == 0) {
                            matrix3_transpose((matrix3 *)&qIdentity);
                            iVar3 = matrix3_equals((matrix3 *)&q,(matrix3 *)&qIdentity);
                            if (iVar3 == 0) {
                              pcVar12 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(192) : (assertion failed) ((matrix3_equals(&c, &m)))"
                              ;
                            }
                            else {
                              iVar3 = matrix3_equals((matrix3 *)&qIdentity,(matrix3 *)&qB);
                              pcVar12 = (char *)0x0;
                              if (iVar3 == 0) {
                                pcVar12 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(193) : (assertion failed) ((matrix3_equals(&m, &r)))"
                                ;
                              }
                            }
                          }
                          else {
                            pcVar12 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(188) : (assertion failed) ((matrix3_equals(&m, &r) == 0))"
                            ;
                          }
                        }
                        else {
                          pcVar12 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(187) : (assertion failed) ((matrix3_equals(&c, &m) == 0))"
                          ;
                        }
                      }
                    }
                  }
                }
                tests_run = tests_run + 1;
                if (pcVar12 == (char *)0x0) {
                  lVar11 = 9;
                  puVar13 = &DAT_00114f30;
                  pqVar8 = &q;
                  for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
                    *(undefined8 *)pqVar8 = *puVar13;
                    puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                    pqVar8 = (quaternion *)((long)pqVar8 + ((ulong)bVar16 * -2 + 1) * 8);
                  }
                  pdVar14 = (double *)&DAT_00114f78;
                  pmVar5 = (matrix3 *)&qB;
                  for (; lVar11 != 0; lVar11 = lVar11 + -1) {
                    (pmVar5->field_0).m[0] = *pdVar14;
                    pdVar14 = pdVar14 + (ulong)bVar16 * -2 + 1;
                    pmVar5 = (matrix3 *)((long)pmVar5 + (ulong)bVar16 * -0x10 + 8);
                  }
                  test_message = pcVar12;
                  matrix3_transpose((matrix3 *)&q);
                  iVar3 = matrix3_equals((matrix3 *)&q,(matrix3 *)&qB);
                  tests_run = tests_run + 1;
                  test_message = (char *)0x0;
                  pcVar12 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(205) : (assertion failed) ((matrix3_equals(&m, &e)))"
                  ;
                  if (iVar3 != 0) {
                    puVar13 = &DAT_00114fc0;
                    pqVar8 = &q;
                    for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
                      *(undefined8 *)pqVar8 = *puVar13;
                      puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                      pqVar8 = (quaternion *)((long)pqVar8 + ((ulong)bVar16 * -2 + 1) * 8);
                    }
                    dVar1 = matrix3_determinant((matrix3 *)&q);
                    sVar2 = scalar_equalsf(dVar1,-737.0);
                    tests_run = tests_run + 1;
                    test_message = (char *)0x0;
                    pcVar12 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(81) : (assertion failed) ((scalar_equalsf(matrix3_determinant(&m), -737)))"
                    ;
                    if (sVar2 != 0) {
                      puVar13 = &DAT_00115008;
                      pqVar8 = &q;
                      for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
                        *(undefined8 *)pqVar8 = *puVar13;
                        puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                        pqVar8 = (quaternion *)((long)pqVar8 + ((ulong)bVar16 * -2 + 1) * 8);
                      }
                      dVar1 = matrix3_determinant((matrix3 *)&q);
                      sVar2 = scalar_equalsf(dVar1,-717.0);
                      tests_run = tests_run + 1;
                      test_message = (char *)0x0;
                      pcVar12 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(90) : (assertion failed) ((scalar_equalsf(matrix3_determinant(&m), -717)))"
                      ;
                      if (sVar2 != 0) {
                        puVar13 = &DAT_00115050;
                        pqVar8 = &q;
                        for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
                          *(undefined8 *)pqVar8 = *puVar13;
                          puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                          pqVar8 = (quaternion *)((long)pqVar8 + ((ulong)bVar16 * -2 + 1) * 8);
                        }
                        dVar1 = matrix3_determinant((matrix3 *)&q);
                        sVar2 = scalar_equalsf(dVar1,49.0);
                        tests_run = tests_run + 1;
                        test_message = (char *)0x0;
                        pcVar12 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(99) : (assertion failed) ((scalar_equalsf(matrix3_determinant(&m), 49)))"
                        ;
                        if (sVar2 != 0) {
                          puVar13 = &DAT_00115098;
                          pqVar8 = &q;
                          for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
                            *(undefined8 *)pqVar8 = *puVar13;
                            puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                            pqVar8 = (quaternion *)((long)pqVar8 + ((ulong)bVar16 * -2 + 1) * 8);
                          }
                          dVar1 = matrix3_determinant((matrix3 *)&q);
                          sVar2 = scalar_equalsf(dVar1,0.0198033);
                          tests_run = tests_run + 1;
                          test_message = (char *)0x0;
                          pcVar12 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(108) : (assertion failed) ((scalar_equalsf(matrix3_determinant(&m), (double)0.0198033)))"
                          ;
                          if (sVar2 != 0) {
                            puVar13 = &DAT_001150e0;
                            pqVar8 = &q;
                            for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
                              *(undefined8 *)pqVar8 = *puVar13;
                              puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                              pqVar8 = (quaternion *)((long)pqVar8 + ((ulong)bVar16 * -2 + 1) * 8);
                            }
                            matrix3_identity((matrix3 *)&qB);
                            matrix3_identity((matrix3 *)&q);
                            pmVar5 = matrix3_set((matrix3 *)&qIdentity,(matrix3 *)&q);
                            pmVar5 = matrix3_invert(pmVar5);
                            if (pmVar5 == (matrix3 *)0x0) {
                              pcVar12 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(128) : (assertion failed) ((hasInverse))"
                              ;
                            }
                            else {
                              matrix3_identity((matrix3 *)&angle1);
                              matrix3_multiply((matrix3 *)&angle1,(matrix3 *)&qIdentity);
                              matrix3_multiply((matrix3 *)&angle1,(matrix3 *)&q);
                              iVar3 = matrix3_equals((matrix3 *)&qB,(matrix3 *)&angle1);
                              pcVar12 = (char *)0x0;
                              if (iVar3 == 0) {
                                pcVar12 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(134) : (assertion failed) ((matrix3_equals(&identity, &scratchMatrix)))"
                                ;
                              }
                            }
                            tests_run = tests_run + 1;
                            if (pcVar12 == (char *)0x0) {
                              lVar11 = 9;
                              puVar13 = &DAT_001150e0;
                              pqVar8 = &q;
                              for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
                                *(undefined8 *)pqVar8 = *puVar13;
                                puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                                pqVar8 = (quaternion *)((long)pqVar8 + ((ulong)bVar16 * -2 + 1) * 8)
                                ;
                              }
                              pdVar14 = (double *)&DAT_00115128;
                              pqVar8 = &qB;
                              for (; lVar11 != 0; lVar11 = lVar11 + -1) {
                                (pqVar8->field_0).q[0] = *pdVar14;
                                pdVar14 = pdVar14 + (ulong)bVar16 * -2 + 1;
                                pqVar8 = (quaternion *)((long)pqVar8 + (ulong)bVar16 * -0x10 + 8);
                              }
                              test_message = pcVar12;
                              dVar1 = matrix3_determinant((matrix3 *)&q);
                              sVar2 = scalar_equalsf(dVar1,-7.0);
                              if (sVar2 == 0) {
                                pcVar12 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(149) : (assertion failed) ((scalar_equalsf(determinant, -7)))"
                                ;
                                bVar15 = false;
                              }
                              else {
                                for (lVar11 = 0; lVar11 != 9; lVar11 = lVar11 + 1) {
                                  qB.field_0.q[lVar11] = qB.field_0.q[lVar11] / dVar1;
                                }
                                matrix3_invert((matrix3 *)&q);
                                pcVar12 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(156) : (assertion failed) ((scalar_equalsf(m.m[i], expected.m[i])))"
                                ;
                                lVar11 = 0;
                                do {
                                  bVar15 = lVar11 == 9;
                                  if (bVar15) {
                                    pcVar12 = (char *)0x0;
                                    break;
                                  }
                                  sVar2 = scalar_equalsf(q.field_0.q[lVar11],qB.field_0.q[lVar11]);
                                  lVar11 = lVar11 + 1;
                                } while (sVar2 != 0);
                              }
                              tests_run = tests_run + 1;
                              if (bVar15) {
                                qB.field_0._0_16_ = ZEXT816(0x3ff0000000000000) << 0x40;
                                qIdentity.field_0.q[0] = 0.10000000149011612;
                                qIdentity.field_0.q[1] = 0.10000000149011612;
                                angle1 = 0.10000000149011612;
                                uStack_1c0 = 1.100000023841858;
                                test_message = pcVar12;
                                matrix3_make_transformation_translationv2
                                          ((matrix3 *)&q,(vector2 *)&qIdentity);
                                vector2_multiplym3((vector2 *)&qB,(matrix3 *)&q);
                                iVar3 = vector2_equals((vector2 *)&qB,(vector2 *)&angle1);
                                tests_run = tests_run + 1;
                                test_message = (char *)0x0;
                                pcVar12 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(236) : (assertion failed) ((vector2_equals(&startingPosition, &expectedPosition)))"
                                ;
                                if (iVar3 != 0) {
                                  qB.field_0._0_16_ = ZEXT816(0x3ff0000000000000) << 0x40;
                                  qIdentity.field_0.q[0] = -0.10000000149011612;
                                  qIdentity.field_0.q[1] = -0.10000000149011612;
                                  angle1 = -0.10000000149011612;
                                  uStack_1c0 = 0.8999999761581421;
                                  matrix3_make_transformation_translationv2
                                            ((matrix3 *)&q,(vector2 *)&qIdentity);
                                  vector2_multiplym3((vector2 *)&qB,(matrix3 *)&q);
                                  iVar3 = vector2_equals((vector2 *)&qB,(vector2 *)&angle1);
                                  tests_run = tests_run + 1;
                                  test_message = (char *)0x0;
                                  pcVar12 = 
                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(252) : (assertion failed) ((vector2_equals(&startingPosition, &expectedPosition)))"
                                  ;
                                  if (iVar3 != 0) {
                                    qB.field_0._0_16_ = ZEXT816(0x3ff0000000000000) << 0x40;
                                    qIdentity.field_0.q[0] = 0.10000000149011612;
                                    qIdentity.field_0.q[1] = 0.10000000149011612;
                                    angle1 = 0.0;
                                    uStack_1c0 = 0.10000000149011612;
                                    matrix3_make_transformation_scalingv2
                                              ((matrix3 *)&q,(vector2 *)&qIdentity);
                                    vector2_multiplym3((vector2 *)&qB,(matrix3 *)&q);
                                    iVar3 = vector2_equals((vector2 *)&qB,(vector2 *)&angle1);
                                    tests_run = tests_run + 1;
                                    test_message = (char *)0x0;
                                    pcVar12 = 
                                    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(268) : (assertion failed) ((vector2_equals(&startingPosition, &expectedPosition)))"
                                    ;
                                    if (iVar3 != 0) {
                                      matrix3_make_transformation_rotationf_z
                                                ((matrix3 *)&q,1.5707963705062866);
                                      pvVar9 = vector2_get_reference_vector2(1);
                                      vector2_set((vector2 *)&qB,pvVar9);
                                      vector2_multiplym3((vector2 *)&qB,(matrix3 *)&q);
                                      pvVar9 = vector2_get_reference_vector2(2);
                                      iVar3 = vector2_equals((vector2 *)&qB,pvVar9);
                                      tests_run = tests_run + 1;
                                      test_message = (char *)0x0;
                                      pcVar12 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(282) : (assertion failed) ((vector2_equals(&r, vector2_get_reference_vector2(2))))"
                                      ;
                                      if (iVar3 != 0) {
                                        pvVar9 = vector2_get_reference_vector2(1);
                                        vector2_set((vector2 *)&qB,pvVar9);
                                        matrix3_identity((matrix3 *)&q);
                                        matrix3_rotate((matrix3 *)&q,1.5707963705062866);
                                        vector2_multiplym3((vector2 *)&qB,(matrix3 *)&q);
                                        pvVar9 = vector2_get_reference_vector2(2);
                                        iVar3 = vector2_equals((vector2 *)&qB,pvVar9);
                                        tests_run = tests_run + 1;
                                        test_message = (char *)0x0;
                                        pcVar12 = 
                                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(297) : (assertion failed) ((vector2_equals(&r, vector2_get_reference_vector2(2))))"
                                        ;
                                        if (iVar3 != 0) {
                                          pvVar9 = vector2_get_reference_vector2(1);
                                          vector2_set((vector2 *)&qB,pvVar9);
                                          matrix3_identity((matrix3 *)&q);
                                          matrix3_rotate((matrix3 *)&q,-1.5707963705062866);
                                          vector2_multiplym3((vector2 *)&qB,(matrix3 *)&q);
                                          pvVar9 = vector2_get_reference_vector2(4);
                                          iVar3 = vector2_equals((vector2 *)&qB,pvVar9);
                                          pcVar12 = (char *)0x0;
                                          if (iVar3 == 0) {
                                            pcVar12 = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(312) : (assertion failed) ((vector2_equals(&r, vector2_get_reference_vector2(4))))"
                                            ;
                                          }
                                          tests_run = tests_run + 1;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      tests_run = tests_run + 1;
      test_message = pcVar12;
      if (pcVar12 == (char *)0x0) {
        puts("matrix4_all_tests");
        matrix4_zero((matrix4 *)&q);
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(11) : (assertion failed) ((scalar_equalsf(zero.m[i], 0.0f)))"
        ;
        lVar11 = 0;
        do {
          lVar10 = lVar11;
          if (lVar10 == 0x10) {
            pcVar12 = (char *)0x0;
            break;
          }
          sVar2 = scalar_equalsf(q.field_0.q[lVar10],0.0);
          lVar11 = lVar10 + 1;
        } while (sVar2 != 0);
        tests_run = tests_run + 1;
        if (lVar10 == 0x10) {
          test_message = pcVar12;
          matrix4_identity((matrix4 *)&qB);
          _matrix4_set_random((matrix4 *)&q);
          iVar3 = matrix4_equals((matrix4 *)&qB,(matrix4 *)&qB);
          if (iVar3 == 0) {
            pcVar12 = 
            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(26) : (assertion failed) ((matrix4_equals(&identity, &identity)))"
            ;
          }
          else {
            iVar3 = matrix4_equals((matrix4 *)&qB,(matrix4 *)&q);
            pcVar12 = (char *)0x0;
            if (iVar3 != 0) {
              pcVar12 = 
              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(29) : (assertion failed) ((matrix4_equals(&identity, &m) == 0))"
              ;
            }
          }
          tests_run = tests_run + 1;
          if (pcVar12 == (char *)0x0) {
            test_message = pcVar12;
            matrix4_identity((matrix4 *)&qIdentity);
            _matrix4_set_random((matrix4 *)&q);
            matrix4_set((matrix4 *)&qB,(matrix4 *)&q);
            matrix4_multiply((matrix4 *)&qB,(matrix4 *)&qIdentity);
            iVar3 = matrix4_equals((matrix4 *)&qB,(matrix4 *)&q);
            tests_run = tests_run + 1;
            test_message = (char *)0x0;
            pcVar12 = 
            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(49) : (assertion failed) ((matrix4_equals(&m2, &m1)))"
            ;
            if (iVar3 != 0) {
              q.field_0.q[0] = 1.0;
              q.field_0.q[1] = 2.0;
              q.field_0.q[2] = 3.0;
              q.field_0.q[3] = 4.0;
              qIdentity.field_0.q[0] = 90.0;
              qIdentity.field_0.q[1] = 100.0;
              qIdentity.field_0.q[2] = 110.0;
              qIdentity.field_0.q[3] = 120.0;
              matrix4_set((matrix4 *)&qB,(matrix4 *)&q);
              matrix4_multiply((matrix4 *)&qB,(matrix4 *)&q);
              iVar3 = matrix4_equals((matrix4 *)&qIdentity,(matrix4 *)&qB);
              tests_run = tests_run + 1;
              test_message = (char *)0x0;
              pcVar12 = 
              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(73) : (assertion failed) ((matrix4_equals(&mR, &m2)))"
              ;
              if (iVar3 != 0) {
                matrix4_zero((matrix4 *)&q);
                matrix4_zero((matrix4 *)&qB);
                matrix4_zero((matrix4 *)&qIdentity);
                _matrix4_set_random((matrix4 *)&qIdentity);
                matrix4_set((matrix4 *)&q,(matrix4 *)&qIdentity);
                matrix4_set((matrix4 *)&qB,(matrix4 *)&qIdentity);
                iVar3 = matrix4_equals((matrix4 *)&q,(matrix4 *)&qB);
                if (iVar3 == 0) {
                  pcVar12 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(217) : (assertion failed) ((matrix4_equals(&c, &r)))"
                  ;
                }
                else {
                  iVar3 = matrix4_equals((matrix4 *)&q,(matrix4 *)&qIdentity);
                  if (iVar3 == 0) {
                    pcVar12 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(218) : (assertion failed) ((matrix4_equals(&c, &m)))"
                    ;
                  }
                  else {
                    iVar3 = matrix4_equals((matrix4 *)&qIdentity,(matrix4 *)&qB);
                    if (iVar3 == 0) {
                      pcVar12 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(219) : (assertion failed) ((matrix4_equals(&m, &r)))"
                      ;
                    }
                    else {
                      _matrix4_transpose_rowcolumn((matrix4 *)&qB);
                      _matrix4_transpose_columnrow((matrix4 *)&q);
                      iVar3 = matrix4_equals((matrix4 *)&q,(matrix4 *)&qB);
                      if (iVar3 == 0) {
                        pcVar12 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(225) : (assertion failed) ((matrix4_equals(&c, &r)))"
                        ;
                      }
                      else {
                        iVar3 = matrix4_equals((matrix4 *)&q,(matrix4 *)&qIdentity);
                        if (iVar3 == 0) {
                          iVar3 = matrix4_equals((matrix4 *)&qIdentity,(matrix4 *)&qB);
                          if (iVar3 == 0) {
                            matrix4_transpose((matrix4 *)&qIdentity);
                            iVar3 = matrix4_equals((matrix4 *)&q,(matrix4 *)&qIdentity);
                            if (iVar3 == 0) {
                              pcVar12 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(231) : (assertion failed) ((matrix4_equals(&c, &m)))"
                              ;
                            }
                            else {
                              iVar3 = matrix4_equals((matrix4 *)&qIdentity,(matrix4 *)&qB);
                              pcVar12 = (char *)0x0;
                              if (iVar3 == 0) {
                                pcVar12 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(232) : (assertion failed) ((matrix4_equals(&m, &r)))"
                                ;
                              }
                            }
                          }
                          else {
                            pcVar12 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(227) : (assertion failed) ((matrix4_equals(&m, &r) == 0))"
                            ;
                          }
                        }
                        else {
                          pcVar12 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(226) : (assertion failed) ((matrix4_equals(&c, &m) == 0))"
                          ;
                        }
                      }
                    }
                  }
                }
                tests_run = tests_run + 1;
                if (pcVar12 == (char *)0x0) {
                  lVar11 = 0x10;
                  puVar13 = &DAT_00115170;
                  pqVar8 = &q;
                  for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
                    *(undefined8 *)pqVar8 = *puVar13;
                    puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                    pqVar8 = (quaternion *)((long)pqVar8 + ((ulong)bVar16 * -2 + 1) * 8);
                  }
                  pdVar14 = (double *)&DAT_001151f0;
                  pmVar6 = (matrix4 *)&qB;
                  for (; lVar11 != 0; lVar11 = lVar11 + -1) {
                    (pmVar6->field_0).m[0] = *pdVar14;
                    pdVar14 = pdVar14 + (ulong)bVar16 * -2 + 1;
                    pmVar6 = (matrix4 *)((long)pmVar6 + (ulong)bVar16 * -0x10 + 8);
                  }
                  test_message = pcVar12;
                  matrix4_transpose((matrix4 *)&q);
                  iVar3 = matrix4_equals((matrix4 *)&q,(matrix4 *)&qB);
                  tests_run = tests_run + 1;
                  test_message = (char *)0x0;
                  pcVar12 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(169) : (assertion failed) ((matrix4_equals(&m, &e)))"
                  ;
                  if (iVar3 != 0) {
                    puVar13 = &DAT_00115270;
                    pqVar8 = &q;
                    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
                      *(undefined8 *)pqVar8 = *puVar13;
                      puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                      pqVar8 = (quaternion *)((long)pqVar8 + ((ulong)bVar16 * -2 + 1) * 8);
                    }
                    dVar1 = matrix4_determinant((matrix4 *)&q);
                    sVar2 = scalar_equalsf(dVar1,-240.0);
                    tests_run = tests_run + 1;
                    test_message = (char *)0x0;
                    pcVar12 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(179) : (assertion failed) ((scalar_equalsf(matrix4_determinant(&m), -240)))"
                    ;
                    if (sVar2 != 0) {
                      puVar13 = &DAT_001152f0;
                      pqVar8 = &q;
                      for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
                        *(undefined8 *)pqVar8 = *puVar13;
                        puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                        pqVar8 = (quaternion *)((long)pqVar8 + ((ulong)bVar16 * -2 + 1) * 8);
                      }
                      dVar1 = matrix4_determinant((matrix4 *)&q);
                      sVar2 = scalar_equalsf(dVar1,-26.0);
                      tests_run = tests_run + 1;
                      test_message = (char *)0x0;
                      pcVar12 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(188) : (assertion failed) ((scalar_equalsf(matrix4_determinant(&m), -26)))"
                      ;
                      if (sVar2 != 0) {
                        puVar13 = &DAT_00115370;
                        pqVar8 = &q;
                        for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
                          *(undefined8 *)pqVar8 = *puVar13;
                          puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                          pqVar8 = (quaternion *)((long)pqVar8 + ((ulong)bVar16 * -2 + 1) * 8);
                        }
                        dVar1 = matrix4_determinant((matrix4 *)&q);
                        sVar2 = scalar_equalsf(dVar1,-6.0);
                        tests_run = tests_run + 1;
                        test_message = (char *)0x0;
                        pcVar12 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(197) : (assertion failed) ((scalar_equalsf(matrix4_determinant(&m), -6)))"
                        ;
                        if (sVar2 != 0) {
                          qB.field_0.q[1] = 1.399999976158142;
                          qB.field_0.q[0] = 4.300000190734863;
                          qIdentity.field_0.q[0] = 4.300000190734863;
                          qIdentity.field_0.q[1] = 1.399999976158142;
                          matrix4_identity((matrix4 *)&q);
                          matrix4_multiplyv2((matrix4 *)&q,(vector2 *)&qB,(vector2 *)&angle1);
                          iVar3 = vector2_equals((vector2 *)&angle1,(vector2 *)&qIdentity);
                          tests_run = tests_run + 1;
                          test_message = (char *)0x0;
                          pcVar12 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(90) : (assertion failed) ((vector2_equals(&r, &expectedPosition)))"
                          ;
                          if (iVar3 != 0) {
                            qB.field_0.q[1] = 1.399999976158142;
                            qB.field_0.q[0] = 4.300000190734863;
                            qB.field_0.q[2] = 3.6700000762939453;
                            qIdentity.field_0.q[0] = 4.300000190734863;
                            qIdentity.field_0.q[1] = 1.399999976158142;
                            qIdentity.field_0.q[2] = 3.6700000762939453;
                            matrix4_identity((matrix4 *)&q);
                            matrix4_multiplyv3((matrix4 *)&q,(vector3 *)&qB,(vector3 *)&angle1);
                            iVar3 = vector3_equals((vector3 *)&angle1,(vector3 *)&qIdentity);
                            tests_run = tests_run + 1;
                            test_message = (char *)0x0;
                            pcVar12 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(140) : (assertion failed) ((vector3_equals(&r, &expectedPosition)))"
                            ;
                            if (iVar3 != 0) {
                              qB.field_0.q[2] = 3.6700000762939453;
                              qB.field_0.q[3] = 2.4000000953674316;
                              qB.field_0.q[1] = 1.399999976158142;
                              qB.field_0.q[0] = 4.300000190734863;
                              qIdentity.field_0.q[2] = 3.6700000762939453;
                              qIdentity.field_0.q[3] = 2.4000000953674316;
                              qIdentity.field_0.q[0] = 4.300000190734863;
                              qIdentity.field_0.q[1] = 1.399999976158142;
                              matrix4_identity((matrix4 *)&q);
                              matrix4_multiplyv4((matrix4 *)&q,(vector4 *)&qB,(vector4 *)&angle1);
                              iVar3 = vector4_equals((vector4 *)&angle1,(vector4 *)&qIdentity);
                              tests_run = tests_run + 1;
                              test_message = (char *)0x0;
                              pcVar12 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(157) : (assertion failed) ((vector4_equals(&r, &expectedPosition)))"
                              ;
                              if (iVar3 != 0) {
                                qB.field_0._0_16_ = ZEXT816(0x3ff0000000000000) << 0x40;
                                qB.field_0.q[2] = 0.0;
                                qIdentity.field_0.q[0] = 0.10000000149011612;
                                qIdentity.field_0.q[1] = 0.10000000149011612;
                                qIdentity.field_0.q[2] = 0.10000000149011612;
                                angle1 = 0.10000000149011612;
                                uStack_1c0 = 1.100000023841858;
                                local_1b8 = 0.10000000149011612;
                                matrix4_make_transformation_translationv3
                                          ((matrix4 *)&q,(vector3 *)&qIdentity);
                                vector3_multiplym4((vector3 *)&qB,(matrix4 *)&q);
                                iVar3 = vector3_equals((vector3 *)&qB,(vector3 *)&angle1);
                                tests_run = tests_run + 1;
                                test_message = (char *)0x0;
                                pcVar12 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(248) : (assertion failed) ((vector3_equals(&startingPosition, &expectedPosition)))"
                                ;
                                if (iVar3 != 0) {
                                  qB.field_0._0_16_ = ZEXT816(0x3ff0000000000000) << 0x40;
                                  qB.field_0.q[2] = 0.0;
                                  qIdentity.field_0.q[0] = -0.10000000149011612;
                                  qIdentity.field_0.q[1] = -0.10000000149011612;
                                  qIdentity.field_0.q[2] = -0.10000000149011612;
                                  angle1 = -0.10000000149011612;
                                  uStack_1c0 = 0.8999999761581421;
                                  local_1b8 = -0.10000000149011612;
                                  matrix4_make_transformation_translationv3
                                            ((matrix4 *)&q,(vector3 *)&qIdentity);
                                  vector3_multiplym4((vector3 *)&qB,(matrix4 *)&q);
                                  iVar3 = vector3_equals((vector3 *)&qB,(vector3 *)&angle1);
                                  tests_run = tests_run + 1;
                                  test_message = (char *)0x0;
                                  pcVar12 = 
                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(264) : (assertion failed) ((vector3_equals(&startingPosition, &expectedPosition)))"
                                  ;
                                  if (iVar3 != 0) {
                                    qB.field_0._0_16_ = ZEXT816(0x3ff0000000000000) << 0x40;
                                    qB.field_0.q[2] = 0.0;
                                    qIdentity.field_0.q[0] = 0.10000000149011612;
                                    qIdentity.field_0.q[1] = 0.10000000149011612;
                                    qIdentity.field_0.q[2] = 0.10000000149011612;
                                    angle1 = 0.0;
                                    uStack_1c0 = 0.10000000149011612;
                                    local_1b8 = 0.0;
                                    matrix4_make_transformation_scalingv3
                                              ((matrix4 *)&q,(vector3 *)&qIdentity);
                                    vector3_multiplym4((vector3 *)&qB,(matrix4 *)&q);
                                    iVar3 = vector3_equals((vector3 *)&qB,(vector3 *)&angle1);
                                    tests_run = tests_run + 1;
                                    test_message = (char *)0x0;
                                    pcVar12 = 
                                    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(280) : (assertion failed) ((vector3_equals(&startingPosition, &expectedPosition)))"
                                    ;
                                    if (iVar3 != 0) {
                                      qIdentity.field_0.q[0] = 1.0;
                                      qIdentity.field_0.q[1] = 1.0;
                                      qIdentity.field_0.q[2] = 1.0;
                                      angle1 = 0.10000000149011612;
                                      uStack_1c0 = 0.10000000149011612;
                                      local_1b8 = 0.10000000149011612;
                                      out_anglez = -0.10000000149011612;
                                      uStack_e0 = -0.10000000149011612;
                                      local_d8 = -0.10000000149011612;
                                      out_anglex_2 = 0.0;
                                      uStack_100 = 0.0;
                                      local_f8 = -0.0;
                                      matrix4_identity((matrix4 *)&q);
                                      pmVar6 = matrix4_make_transformation_scalingv3
                                                         ((matrix4 *)&qB,(vector3 *)&angle1);
                                      matrix4_multiply((matrix4 *)&q,pmVar6);
                                      pmVar6 = matrix4_make_transformation_translationv3
                                                         ((matrix4 *)&qB,(vector3 *)&out_anglez);
                                      matrix4_multiply((matrix4 *)&q,pmVar6);
                                      vector3_multiplym4((vector3 *)&qIdentity,(matrix4 *)&q);
                                      iVar3 = vector3_equals((vector3 *)&qIdentity,
                                                             (vector3 *)&out_anglex_2);
                                      tests_run = tests_run + 1;
                                      test_message = (char *)0x0;
                                      pcVar12 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(300) : (assertion failed) ((vector3_equals(&startingPosition, &expectedPosition)))"
                                      ;
                                      if (iVar3 != 0) {
                                        local_1b8 = 0.0;
                                        angle1 = 0.0;
                                        uStack_1c0 = 1.0;
                                        out_anglez = 0.10000000149011612;
                                        uStack_e0 = 0.10000000149011612;
                                        local_d8 = 0.10000000149011612;
                                        out_anglex_2 = 0.0;
                                        uStack_100 = 1.100000023841858;
                                        local_f8 = 0.0;
                                        out_angley_2 = 0.0;
                                        uStack_140 = 1.0;
                                        local_138 = 0.0;
                                        matrix4_identity((matrix4 *)&q);
                                        pmVar6 = matrix4_make_transformation_scalingv3
                                                           ((matrix4 *)&qB,(vector3 *)&out_anglez);
                                        matrix4_multiply((matrix4 *)&q,pmVar6);
                                        pmVar6 = matrix4_make_transformation_translationv3
                                                           ((matrix4 *)&qIdentity,
                                                            (vector3 *)&out_angley_2);
                                        matrix4_multiply((matrix4 *)&q,pmVar6);
                                        vector3_multiplym4((vector3 *)&angle1,(matrix4 *)&q);
                                        iVar3 = vector3_equals((vector3 *)&angle1,
                                                               (vector3 *)&out_anglex_2);
                                        tests_run = tests_run + 1;
                                        test_message = (char *)0x0;
                                        pcVar12 = 
                                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(600) : (assertion failed) ((vector3_equals(&startingPosition, &expectedPosition)))"
                                        ;
                                        if (iVar3 != 0) {
                                          angle1 = 4.300000190734863;
                                          uStack_1c0 = 7.400000095367432;
                                          qB.field_0.q[2] = 0.0;
                                          qB.field_0.q[1] = 0.10000000149011612;
                                          qB.field_0.q[0] = 0.10000000149011612;
                                          out_anglez = 4.400000095367432;
                                          uStack_e0 = 7.5;
                                          matrix4_make_transformation_translationv3
                                                    ((matrix4 *)&q,(vector3 *)&qB);
                                          matrix4_multiplyv2((matrix4 *)&q,(vector2 *)&angle1,
                                                             (vector2 *)&qIdentity);
                                          iVar3 = vector2_equals((vector2 *)&qIdentity,
                                                                 (vector2 *)&out_anglez);
                                          tests_run = tests_run + 1;
                                          test_message = (char *)0x0;
                                          pcVar12 = 
                                          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(107) : (assertion failed) ((vector2_equals(&r, &expectedPosition)))"
                                          ;
                                          if (iVar3 != 0) {
                                            angle1 = 4.300000190734863;
                                            uStack_1c0 = 7.400000095367432;
                                            qB.field_0.q[1] = 0.10000000149011612;
                                            qB.field_0.q[0] = 0.10000000149011612;
                                            qB.field_0.q[2] = 1.0;
                                            out_anglez = 4.400000095367432;
                                            uStack_e0 = 7.5;
                                            matrix4_make_transformation_translationv3
                                                      ((matrix4 *)&q,(vector3 *)&qB);
                                            matrix4_multiplyv2((matrix4 *)&q,(vector2 *)&angle1,
                                                               (vector2 *)&qIdentity);
                                            iVar3 = vector2_equals((vector2 *)&qIdentity,
                                                                   (vector2 *)&out_anglez);
                                            tests_run = tests_run + 1;
                                            test_message = (char *)0x0;
                                            pcVar12 = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(123) : (assertion failed) ((vector2_equals(&r, &expectedPosition)))"
                                            ;
                                            if (iVar3 != 0) {
                                              matrix4_make_transformation_rotationf_x
                                                        ((matrix4 *)&q,1.5707963705062866);
                                              pvVar7 = vector3_get_reference_vector3(2);
                                              vector3_set((vector3 *)&qB,pvVar7);
                                              vector3_multiplym4((vector3 *)&qB,(matrix4 *)&q);
                                              pvVar7 = vector3_get_reference_vector3(6);
                                              iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                                              tests_run = tests_run + 1;
                                              test_message = (char *)0x0;
                                              pcVar12 = 
                                              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(314) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(6))))"
                                              ;
                                              if (iVar3 != 0) {
                                                matrix4_make_transformation_rotationf_y
                                                          ((matrix4 *)&q,1.5707963705062866);
                                                pvVar7 = vector3_get_reference_vector3(1);
                                                vector3_set((vector3 *)&qB,pvVar7);
                                                vector3_multiplym4((vector3 *)&qB,(matrix4 *)&q);
                                                pvVar7 = vector3_get_reference_vector3(3);
                                                iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                                                tests_run = tests_run + 1;
                                                test_message = (char *)0x0;
                                                pcVar12 = 
                                                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(329) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(3))))"
                                                ;
                                                if (iVar3 != 0) {
                                                  matrix4_make_transformation_rotationf_z
                                                            ((matrix4 *)&q,1.5707963705062866);
                                                  pvVar7 = vector3_get_reference_vector3(1);
                                                  vector3_set((vector3 *)&qB,pvVar7);
                                                  vector3_multiplym4((vector3 *)&qB,(matrix4 *)&q);
                                                  pvVar7 = vector3_get_reference_vector3(5);
                                                  iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                                                  tests_run = tests_run + 1;
                                                  test_message = (char *)0x0;
                                                  pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(343) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(5))))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    pvVar7 = vector3_get_reference_vector3(1);
                                                    vector3_set((vector3 *)&qB,pvVar7);
                                                    matrix4_identity((matrix4 *)&q);
                                                    pvVar7 = vector3_get_reference_vector3(3);
                                                    matrix4_rotatev3((matrix4 *)&q,pvVar7,
                                                                     1.5707963705062866);
                                                    vector3_multiplym4((vector3 *)&qB,(matrix4 *)&q)
                                                    ;
                                                    pvVar7 = vector3_get_reference_vector3(5);
                                                    iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                                                    tests_run = tests_run + 1;
                                                    test_message = (char *)0x0;
                                                    pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(358) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(5))))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    matrix4_identity((matrix4 *)&q);
                                                    pvVar7 = vector3_get_reference_vector3(3);
                                                    matrix4_rotatev3((matrix4 *)&q,pvVar7,
                                                                     -1.5707963705062866);
                                                    pvVar7 = vector3_get_reference_vector3(1);
                                                    vector3_set((vector3 *)&qB,pvVar7);
                                                    vector3_multiplym4((vector3 *)&qB,(matrix4 *)&q)
                                                    ;
                                                    pvVar7 = vector3_get_reference_vector3(2);
                                                    iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                                                    tests_run = tests_run + 1;
                                                    test_message = (char *)0x0;
                                                    pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(373) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(2))))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    matrix4_identity((matrix4 *)&q);
                                                    pvVar7 = vector3_get_reference_vector3(2);
                                                    matrix4_rotatev3((matrix4 *)&q,pvVar7,
                                                                     1.5707963705062866);
                                                    pvVar7 = vector3_get_reference_vector3(1);
                                                    vector3_set((vector3 *)&qB,pvVar7);
                                                    vector3_multiplym4((vector3 *)&qB,(matrix4 *)&q)
                                                    ;
                                                    pvVar7 = vector3_get_reference_vector3(3);
                                                    iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                                                    tests_run = tests_run + 1;
                                                    test_message = (char *)0x0;
                                                    pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(388) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(3))))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    matrix4_identity((matrix4 *)&q);
                                                    pvVar7 = vector3_get_reference_vector3(2);
                                                    matrix4_rotatev3((matrix4 *)&q,pvVar7,
                                                                     -1.5707963705062866);
                                                    pvVar7 = vector3_get_reference_vector3(1);
                                                    vector3_set((vector3 *)&qB,pvVar7);
                                                    vector3_multiplym4((vector3 *)&qB,(matrix4 *)&q)
                                                    ;
                                                    pvVar7 = vector3_get_reference_vector3(6);
                                                    iVar3 = vector3_equals((vector3 *)&qB,pvVar7);
                                                    tests_run = tests_run + 1;
                                                    test_message = (char *)0x0;
                                                    pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(403) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(6))))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    pvVar7 = vector3_get_reference_vector3(1);
                                                    pqVar8 = quaternion_set_from_axis_anglev3
                                                                       (&qB,pvVar7,
                                                                        1.5707963705062866);
                                                    matrix4_make_transformation_rotationq
                                                              ((matrix4 *)&q,pqVar8);
                                                    pvVar7 = vector3_get_reference_vector3(2);
                                                    pvVar7 = vector3_set((vector3 *)&qIdentity,
                                                                         pvVar7);
                                                    vector3_multiplym4(pvVar7,(matrix4 *)&q);
                                                    pvVar7 = vector3_get_reference_vector3(6);
                                                    iVar3 = vector3_equals((vector3 *)&qIdentity,
                                                                           pvVar7);
                                                    tests_run = tests_run + 1;
                                                    test_message = (char *)0x0;
                                                    pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(417) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(6))))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    pvVar7 = vector3_get_reference_vector3(1);
                                                    pqVar8 = quaternion_set_from_axis_anglev3
                                                                       (&qB,pvVar7,
                                                                        1.5707963705062866);
                                                    matrix4_make_transformation_rotationq
                                                              ((matrix4 *)&q,pqVar8);
                                                    pvVar7 = vector3_get_reference_vector3(3);
                                                    pvVar7 = vector3_set((vector3 *)&qIdentity,
                                                                         pvVar7);
                                                    vector3_multiplym4(pvVar7,(matrix4 *)&q);
                                                    pvVar7 = vector3_get_reference_vector3(2);
                                                    iVar3 = vector3_equals((vector3 *)&qIdentity,
                                                                           pvVar7);
                                                    tests_run = tests_run + 1;
                                                    test_message = (char *)0x0;
                                                    pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(431) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(2))))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    pvVar7 = vector3_get_reference_vector3(2);
                                                    pqVar8 = quaternion_set_from_axis_anglev3
                                                                       (&qB,pvVar7,
                                                                        1.5707963705062866);
                                                    matrix4_make_transformation_rotationq
                                                              ((matrix4 *)&q,pqVar8);
                                                    pvVar7 = vector3_get_reference_vector3(1);
                                                    pvVar7 = vector3_set((vector3 *)&qIdentity,
                                                                         pvVar7);
                                                    vector3_multiplym4(pvVar7,(matrix4 *)&q);
                                                    pvVar7 = vector3_get_reference_vector3(3);
                                                    iVar3 = vector3_equals((vector3 *)&qIdentity,
                                                                           pvVar7);
                                                    tests_run = tests_run + 1;
                                                    test_message = (char *)0x0;
                                                    pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(445) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(3))))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    pvVar7 = vector3_get_reference_vector3(2);
                                                    pqVar8 = quaternion_set_from_axis_anglev3
                                                                       (&qB,pvVar7,
                                                                        1.5707963705062866);
                                                    matrix4_make_transformation_rotationq
                                                              ((matrix4 *)&q,pqVar8);
                                                    pvVar7 = vector3_get_reference_vector3(3);
                                                    pvVar7 = vector3_set((vector3 *)&qIdentity,
                                                                         pvVar7);
                                                    vector3_multiplym4(pvVar7,(matrix4 *)&q);
                                                    pvVar7 = vector3_get_reference_vector3(4);
                                                    iVar3 = vector3_equals((vector3 *)&qIdentity,
                                                                           pvVar7);
                                                    tests_run = tests_run + 1;
                                                    test_message = (char *)0x0;
                                                    pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(459) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(4))))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    pvVar7 = vector3_get_reference_vector3(3);
                                                    pqVar8 = quaternion_set_from_axis_anglev3
                                                                       (&qB,pvVar7,
                                                                        1.5707963705062866);
                                                    matrix4_make_transformation_rotationq
                                                              ((matrix4 *)&q,pqVar8);
                                                    pvVar7 = vector3_get_reference_vector3(1);
                                                    pvVar7 = vector3_set((vector3 *)&qIdentity,
                                                                         pvVar7);
                                                    vector3_multiplym4(pvVar7,(matrix4 *)&q);
                                                    pvVar7 = vector3_get_reference_vector3(5);
                                                    iVar3 = vector3_equals((vector3 *)&qIdentity,
                                                                           pvVar7);
                                                    tests_run = tests_run + 1;
                                                    test_message = (char *)0x0;
                                                    pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(473) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(5))))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    pvVar7 = vector3_get_reference_vector3(3);
                                                    pqVar8 = quaternion_set_from_axis_anglev3
                                                                       (&qB,pvVar7,
                                                                        1.5707963705062866);
                                                    matrix4_make_transformation_rotationq
                                                              ((matrix4 *)&q,pqVar8);
                                                    pvVar7 = vector3_get_reference_vector3(2);
                                                    pvVar7 = vector3_set((vector3 *)&qIdentity,
                                                                         pvVar7);
                                                    vector3_multiplym4(pvVar7,(matrix4 *)&q);
                                                    pvVar7 = vector3_get_reference_vector3(1);
                                                    iVar3 = vector3_equals((vector3 *)&qIdentity,
                                                                           pvVar7);
                                                    tests_run = tests_run + 1;
                                                    test_message = (char *)0x0;
                                                    pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(487) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(1))))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    pvVar7 = vector3_get_reference_vector3(1);
                                                    pqVar8 = quaternion_set_from_axis_anglev3
                                                                       (&qB,pvVar7,
                                                                        3.1415927410125732);
                                                    matrix4_make_transformation_rotationq
                                                              ((matrix4 *)&q,pqVar8);
                                                    pvVar7 = vector3_get_reference_vector3(2);
                                                    pvVar7 = vector3_set((vector3 *)&qIdentity,
                                                                         pvVar7);
                                                    vector3_multiplym4(pvVar7,(matrix4 *)&q);
                                                    pvVar7 = vector3_get_reference_vector3(5);
                                                    iVar3 = vector3_equals((vector3 *)&qIdentity,
                                                                           pvVar7);
                                                    tests_run = tests_run + 1;
                                                    test_message = (char *)0x0;
                                                    pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(501) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(5))))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    pvVar7 = vector3_get_reference_vector3(1);
                                                    quaternion_set_from_axis_anglev3
                                                              (&qB,pvVar7,1.5707963705062866);
                                                    pvVar7 = vector3_get_reference_vector3(3);
                                                    pvVar7 = vector3_set((vector3 *)&angle1,pvVar7);
                                                    vector3_rotate_by_quaternion(pvVar7,&qB);
                                                    pvVar7 = vector3_get_reference_vector3(5);
                                                    iVar3 = vector3_equals((vector3 *)&angle1,pvVar7
                                                                          );
                                                    if (iVar3 == 0) {
                                                      pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(515) : (assertion failed) ((vector3_equals(&vQ, vector3_get_reference_vector3(5))))"
                                                  ;
                                                  }
                                                  else {
                                                    matrix4_make_transformation_rotationf_z
                                                              ((matrix4 *)&q,1.5707963705062866);
                                                    pvVar7 = vector3_get_reference_vector3(1);
                                                    vector3_set((vector3 *)&qIdentity,pvVar7);
                                                    vector3_multiplym4((vector3 *)&qIdentity,
                                                                       (matrix4 *)&q);
                                                    pvVar7 = vector3_get_reference_vector3(5);
                                                    iVar3 = vector3_equals((vector3 *)&qIdentity,
                                                                           pvVar7);
                                                    if (iVar3 == 0) {
                                                      pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(520) : (assertion failed) ((vector3_equals(&vM, vector3_get_reference_vector3(5))))"
                                                  ;
                                                  }
                                                  else {
                                                    iVar3 = vector3_equals((vector3 *)&angle1,
                                                                           (vector3 *)&qIdentity);
                                                    pcVar12 = (char *)0x0;
                                                    if (iVar3 == 0) {
                                                      pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(522) : (assertion failed) ((vector3_equals(&vQ, &vM)))"
                                                  ;
                                                  }
                                                  }
                                                  }
                                                  tests_run = tests_run + 1;
                                                  if (pcVar12 == (char *)0x0) {
                                                    local_138 = 0.0;
                                                    out_angley_2 = 0.0;
                                                    uStack_140 = 1.0;
                                                    out_anglez_2 = 0.10000000149011612;
                                                    uStack_120 = 0.10000000149011612;
                                                    local_118 = 0.10000000149011612;
                                                    expectedPosition_11.field_0.v[0] =
                                                         1.100000023841858;
                                                    expectedPosition_11.field_0.v[1] = 0.0;
                                                    expectedPosition_11.field_0.v[2] = 0.0;
                                                    local_48.v[0] = 0.0;
                                                    local_48.v[1] = 1.0;
                                                    local_48.v[2] = 0.0;
                                                    test_message = pcVar12;
                                                    matrix4_identity((matrix4 *)&q);
                                                    pmVar6 = matrix4_make_transformation_scalingv3
                                                                       ((matrix4 *)&qIdentity,
                                                                        (vector3 *)&out_anglez_2);
                                                    matrix4_multiply((matrix4 *)&q,pmVar6);
                                                    matrix4_identity((matrix4 *)&qB);
                                                    pmVar6 = 
                                                  matrix4_make_transformation_translationv3
                                                            ((matrix4 *)&out_anglez,
                                                             (vector3 *)&local_48.field_1);
                                                  matrix4_multiply((matrix4 *)&qB,pmVar6);
                                                  pvVar7 = vector3_get_reference_vector3(3);
                                                  pqVar8 = quaternion_set_from_axis_anglev3
                                                                     ((quaternion *)&out_anglex_2,
                                                                      pvVar7,1.5707963705062866);
                                                  pmVar6 = matrix4_make_transformation_rotationq
                                                                     ((matrix4 *)&angle1,pqVar8);
                                                  matrix4_multiply((matrix4 *)&qB,pmVar6);
                                                  vector3_multiplym4((vector3 *)&out_angley_2,
                                                                     (matrix4 *)&q);
                                                  vector3_multiplym4((vector3 *)&out_angley_2,
                                                                     (matrix4 *)&qB);
                                                  iVar3 = vector3_equals((vector3 *)&out_angley_2,
                                                                         &expectedPosition_11);
                                                  tests_run = tests_run + 1;
                                                  test_message = (char *)0x0;
                                                  pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(554) : (assertion failed) ((vector3_equals(&startingPosition, &expectedPosition)))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    out_anglex_2 = 0.0;
                                                    uStack_100 = 1.0;
                                                    local_f8 = 0.0;
                                                    out_angley_2 = 0.10000000149011612;
                                                    uStack_140 = 0.10000000149011612;
                                                    local_138 = 0.10000000149011612;
                                                    out_anglez_2 = 1.100000023841858;
                                                    uStack_120 = 0.0;
                                                    local_118 = 0.0;
                                                    expectedPosition_11.field_0.v[0] = 0.0;
                                                    expectedPosition_11.field_0.v[1] = 1.0;
                                                    expectedPosition_11.field_0.v[2] = 0.0;
                                                    matrix4_identity((matrix4 *)&q);
                                                    pmVar6 = matrix4_make_transformation_scalingv3
                                                                       ((matrix4 *)&qB,
                                                                        (vector3 *)&out_angley_2);
                                                    matrix4_multiply((matrix4 *)&q,pmVar6);
                                                    pmVar6 = 
                                                  matrix4_make_transformation_translationv3
                                                            ((matrix4 *)&angle1,&expectedPosition_11
                                                            );
                                                  matrix4_multiply((matrix4 *)&q,pmVar6);
                                                  pvVar7 = vector3_get_reference_vector3(3);
                                                  pqVar8 = quaternion_set_from_axis_anglev3
                                                                     ((quaternion *)&out_anglez,
                                                                      pvVar7,1.5707963705062866);
                                                  pmVar6 = matrix4_make_transformation_rotationq
                                                                     ((matrix4 *)&qIdentity,pqVar8);
                                                  matrix4_multiply((matrix4 *)&q,pmVar6);
                                                  vector3_multiplym4((vector3 *)&out_anglex_2,
                                                                     (matrix4 *)&q);
                                                  iVar3 = vector3_equals((vector3 *)&out_anglex_2,
                                                                         (vector3 *)&out_anglez_2);
                                                  tests_run = tests_run + 1;
                                                  test_message = (char *)0x0;
                                                  pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(579) : (assertion failed) ((vector3_equals(&startingPosition, &expectedPosition)))"
                                                  ;
                                                  if (iVar3 != 0) {
                                                    matrix4_identity((matrix4 *)&qB);
                                                    matrix4_identity((matrix4 *)&q);
                                                    pvVar7 = vector3_setf3((vector3 *)&out_anglez,
                                                                           0.5,0.5,0.5);
                                                    pmVar6 = matrix4_make_transformation_scalingv3
                                                                       ((matrix4 *)&angle1,pvVar7);
                                                    matrix4_multiply((matrix4 *)&q,pmVar6);
                                                    pvVar7 = vector3_setf3((vector3 *)&out_anglez,
                                                                           1.0,0.800000011920929,
                                                                           0.30000001192092896);
                                                    pmVar6 = 
                                                  matrix4_make_transformation_translationv3
                                                            ((matrix4 *)&angle1,pvVar7);
                                                  matrix4_multiply((matrix4 *)&q,pmVar6);
                                                  pmVar6 = matrix4_set_from_euler_anglesf3_EXP
                                                                     ((matrix4 *)&angle1,
                                                                      1.5707963705062866,
                                                                      1.5707963705062866,
                                                                      1.5707963705062866);
                                                  matrix4_multiply((matrix4 *)&q,pmVar6);
                                                  pmVar6 = matrix4_set((matrix4 *)&qIdentity,
                                                                       (matrix4 *)&q);
                                                  pmVar6 = matrix4_invert(pmVar6);
                                                  if (pmVar6 == (matrix4 *)0x0) {
                                                    pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(660) : (assertion failed) ((hasInverse))"
                                                  ;
                                                  }
                                                  else {
                                                    matrix4_identity((matrix4 *)&angle1);
                                                    matrix4_multiply((matrix4 *)&angle1,
                                                                     (matrix4 *)&qIdentity);
                                                    matrix4_multiply((matrix4 *)&angle1,
                                                                     (matrix4 *)&q);
                                                    iVar3 = matrix4_equals((matrix4 *)&qB,
                                                                           (matrix4 *)&angle1);
                                                    pcVar12 = (char *)0x0;
                                                    if (iVar3 == 0) {
                                                      pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(666) : (assertion failed) ((matrix4_equals(&identity, &scratchMatrix)))"
                                                  ;
                                                  }
                                                  }
                                                  tests_run = tests_run + 1;
                                                  if (pcVar12 == (char *)0x0) {
                                                    test_message = pcVar12;
                                                    matrix4_identity((matrix4 *)&q);
                                                    dVar1 = matrix4_determinant((matrix4 *)&q);
                                                    sVar2 = scalar_equalsf(dVar1,0.0);
                                                    if (sVar2 == 0) {
                                                      sVar2 = scalar_equalsf(dVar1,1.0);
                                                      if (sVar2 == 0) {
                                                        pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(615) : (assertion failed) ((scalar_equalsf(det, 1)))"
                                                  ;
                                                  }
                                                  else {
                                                    matrix4_identity((matrix4 *)&q);
                                                    q.field_0.q[0] = 0.0;
                                                    q.field_0.q[1] = 0.0;
                                                    q.field_0.q[2] = 0.0;
                                                    q.field_0.q[3] = 0.0;
                                                    dVar1 = matrix4_determinant((matrix4 *)&q);
                                                    sVar2 = scalar_equalsf(dVar1,0.0);
                                                    if (sVar2 == 0) {
                                                      pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(621) : (assertion failed) ((scalar_equalsf(det, 0)))"
                                                  ;
                                                  }
                                                  else {
                                                    matrix4_identity((matrix4 *)&q);
                                                    dVar1 = matrix4_determinant((matrix4 *)&q);
                                                    sVar2 = scalar_equalsf(dVar1,0.0);
                                                    if (sVar2 == 0) {
                                                      pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(626) : (assertion failed) ((scalar_equalsf(det, 0)))"
                                                  ;
                                                  }
                                                  else {
                                                    matrix4_identity((matrix4 *)&q);
                                                    dVar1 = matrix4_determinant((matrix4 *)&q);
                                                    sVar2 = scalar_equalsf(dVar1,0.0);
                                                    if (sVar2 == 0) {
                                                      pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(631) : (assertion failed) ((scalar_equalsf(det, 0)))"
                                                  ;
                                                  }
                                                  else {
                                                    matrix4_identity((matrix4 *)&q);
                                                    dVar1 = matrix4_determinant((matrix4 *)&q);
                                                    sVar2 = scalar_equalsf(dVar1,0.0);
                                                    pcVar12 = (char *)0x0;
                                                    if (sVar2 == 0) {
                                                      pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(636) : (assertion failed) ((scalar_equalsf(det, 0)))"
                                                  ;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(614) : (assertion failed) ((!scalar_equalsf(det, 0)))"
                                                  ;
                                                  }
                                                  tests_run = tests_run + 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        tests_run = tests_run + 1;
        test_message = pcVar12;
        if (pcVar12 == (char *)0x0) {
          puts("vector3_all_tests");
          vector3_setf3((vector3 *)&q,3.0,-3.0,1.0);
          vector3_setf3((vector3 *)&qB,4.0,9.0,2.0);
          vector3_cross_product((vector3 *)&qIdentity,(vector3 *)&q,(vector3 *)&qB);
          sVar2 = scalar_equalsf(qIdentity.field_0.q[0],-15.0);
          if (sVar2 == 0) {
            test_message = 
            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_vector3.c(14) : (assertion failed) ((scalar_equalsf(r.x, -15.0f)))"
            ;
          }
          else {
            sVar2 = scalar_equalsf(qIdentity.field_0.q[1],-2.0);
            if (sVar2 == 0) {
              test_message = 
              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_vector3.c(15) : (assertion failed) ((scalar_equalsf(r.y, -2.0f)))"
              ;
            }
            else {
              sVar2 = scalar_equalsf(qIdentity.field_0.q[2],39.0);
              if (sVar2 == 0) {
                test_message = 
                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_vector3.c(16) : (assertion failed) ((scalar_equalsf(r.z, 39.0f)))"
                ;
              }
              else {
                vector3_cross_product((vector3 *)&qIdentity,(vector3 *)&qB,(vector3 *)&q);
                sVar2 = scalar_equalsf(qIdentity.field_0.q[0],-15.0);
                if (sVar2 == 0) {
                  sVar2 = scalar_equalsf(qIdentity.field_0.q[1],-2.0);
                  if (sVar2 == 0) {
                    sVar2 = scalar_equalsf(qIdentity.field_0.q[2],39.0);
                    test_message = (char *)0x0;
                    if (sVar2 != 0) {
                      test_message = 
                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_vector3.c(23) : (assertion failed) ((!scalar_equalsf(r.z, 39.0f)))"
                      ;
                    }
                  }
                  else {
                    test_message = 
                    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_vector3.c(22) : (assertion failed) ((!scalar_equalsf(r.y, -2.0f)))"
                    ;
                  }
                }
                else {
                  test_message = 
                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_vector3.c(21) : (assertion failed) ((!scalar_equalsf(r.x, -15.0f)))"
                  ;
                }
              }
            }
          }
          tests_run = tests_run + 2;
          if (test_message == (char *)0x0) {
            puts("experimental_all_tests");
            qIdentity.field_0.q[0] = 1.0;
            qIdentity.field_0.q[1] = 2.0;
            qIdentity.field_0.q[2] = 3.0;
            matrix4_make_transformation_translationv3((matrix4 *)&q,(vector3 *)&qIdentity);
            matrix4_transformation_decompose_EXP
                      ((matrix4 *)&q,(vector3 *)&out_anglez,&qB,(vector3 *)&angle1);
            iVar3 = vector3_equals((vector3 *)&qIdentity,(vector3 *)&angle1);
            tests_run = tests_run + 1;
            test_message = (char *)0x0;
            pcVar12 = 
            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_experimental.c(21) : (assertion failed) ((vector3_equals(&in_translation, &out_translation)))"
            ;
            if (iVar3 != 0) {
              qIdentity.field_0.q[0] = 1.0;
              qIdentity.field_0.q[1] = 2.0;
              qIdentity.field_0.q[2] = 3.0;
              matrix4_make_transformation_scalingv3((matrix4 *)&q,(vector3 *)&qIdentity);
              matrix4_transformation_decompose_EXP
                        ((matrix4 *)&q,(vector3 *)&out_anglez,&qB,(vector3 *)&angle1);
              iVar3 = vector3_equals((vector3 *)&qIdentity,(vector3 *)&out_anglez);
              pcVar12 = (char *)0x0;
              if (iVar3 == 0) {
                pcVar12 = 
                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_experimental.c(44) : (assertion failed) ((vector3_equals(&in_scale, &out_scale)))"
                ;
              }
              tests_run = tests_run + 1;
            }
            tests_run = tests_run + 1;
            test_message = pcVar12;
          }
        }
      }
    }
  }
  return test_message;
}

Assistant:

static char *all_testsuites(void)
{
	printf("quaternion_all_tests\n");
	run_test(quaternion_all_tests);
	printf("matrix2_all_tests\n");
	run_test(matrix2_all_tests);
	printf("matrix3_all_tests\n");
	run_test(matrix3_all_tests);
	printf("matrix4_all_tests\n");
	run_test(matrix4_all_tests);
	printf("vector3_all_tests\n");
	run_test(vector3_all_tests);
	printf("experimental_all_tests\n");
	run_test(experimental_all_tests);

	return NULL;
}